

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  long lVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  uint uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  int iVar101;
  float fVar102;
  undefined4 uVar103;
  float fVar110;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  vint4 bi;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 ai_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  float fVar192;
  float fVar193;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar194;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  __m128 a;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  vfloat4 a0_2;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar222;
  float fVar232;
  float fVar234;
  vfloat4 a0_3;
  undefined1 auVar223 [16];
  float fVar233;
  float fVar235;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar249;
  vfloat4 b0_2;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  vfloat4 b0_3;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar28;
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  float fVar140;
  undefined1 auVar261 [32];
  
  PVar6 = prim[1];
  uVar27 = (ulong)(byte)PVar6;
  lVar29 = uVar27 * 0x25;
  fVar102 = *(float *)(prim + lVar29 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar40 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + lVar29 + 6));
  auVar63._0_4_ = fVar102 * auVar40._0_4_;
  auVar63._4_4_ = fVar102 * auVar40._4_4_;
  auVar63._8_4_ = fVar102 * auVar40._8_4_;
  auVar63._12_4_ = fVar102 * auVar40._12_4_;
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 4 + 6)));
  auVar43._0_4_ = fVar102 * auVar41._0_4_;
  auVar43._4_4_ = fVar102 * auVar41._4_4_;
  auVar43._8_4_ = fVar102 * auVar41._8_4_;
  auVar43._12_4_ = fVar102 * auVar41._12_4_;
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 5 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 6 + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0xf + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar27 + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0x1a + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0x1b + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0x1c + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar149._4_4_ = auVar43._0_4_;
  auVar149._0_4_ = auVar43._0_4_;
  auVar149._8_4_ = auVar43._0_4_;
  auVar149._12_4_ = auVar43._0_4_;
  auVar57 = vshufps_avx(auVar43,auVar43,0x55);
  auVar58 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar102 = auVar58._0_4_;
  auVar68._0_4_ = fVar102 * auVar49._0_4_;
  fVar110 = auVar58._4_4_;
  auVar68._4_4_ = fVar110 * auVar49._4_4_;
  fVar238 = auVar58._8_4_;
  auVar68._8_4_ = fVar238 * auVar49._8_4_;
  fVar222 = auVar58._12_4_;
  auVar68._12_4_ = fVar222 * auVar49._12_4_;
  auVar51._0_4_ = auVar52._0_4_ * fVar102;
  auVar51._4_4_ = auVar52._4_4_ * fVar110;
  auVar51._8_4_ = auVar52._8_4_ * fVar238;
  auVar51._12_4_ = auVar52._12_4_ * fVar222;
  auVar44._0_4_ = auVar56._0_4_ * fVar102;
  auVar44._4_4_ = auVar56._4_4_ * fVar110;
  auVar44._8_4_ = auVar56._8_4_ * fVar238;
  auVar44._12_4_ = auVar56._12_4_ * fVar222;
  auVar58 = vfmadd231ps_fma(auVar68,auVar57,auVar41);
  auVar59 = vfmadd231ps_fma(auVar51,auVar57,auVar55);
  auVar57 = vfmadd231ps_fma(auVar44,auVar54,auVar57);
  auVar60 = vfmadd231ps_fma(auVar58,auVar149,auVar40);
  auVar59 = vfmadd231ps_fma(auVar59,auVar149,auVar48);
  auVar61 = vfmadd231ps_fma(auVar57,auVar53,auVar149);
  auVar254._4_4_ = auVar63._0_4_;
  auVar254._0_4_ = auVar63._0_4_;
  auVar254._8_4_ = auVar63._0_4_;
  auVar254._12_4_ = auVar63._0_4_;
  auVar57 = vshufps_avx(auVar63,auVar63,0x55);
  auVar58 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar102 = auVar58._0_4_;
  auVar150._0_4_ = fVar102 * auVar49._0_4_;
  fVar110 = auVar58._4_4_;
  auVar150._4_4_ = fVar110 * auVar49._4_4_;
  fVar238 = auVar58._8_4_;
  auVar150._8_4_ = fVar238 * auVar49._8_4_;
  fVar222 = auVar58._12_4_;
  auVar150._12_4_ = fVar222 * auVar49._12_4_;
  auVar66._0_4_ = auVar52._0_4_ * fVar102;
  auVar66._4_4_ = auVar52._4_4_ * fVar110;
  auVar66._8_4_ = auVar52._8_4_ * fVar238;
  auVar66._12_4_ = auVar52._12_4_ * fVar222;
  auVar65._0_4_ = auVar56._0_4_ * fVar102;
  auVar65._4_4_ = auVar56._4_4_ * fVar110;
  auVar65._8_4_ = auVar56._8_4_ * fVar238;
  auVar65._12_4_ = auVar56._12_4_ * fVar222;
  auVar41 = vfmadd231ps_fma(auVar150,auVar57,auVar41);
  auVar49 = vfmadd231ps_fma(auVar66,auVar57,auVar55);
  auVar55 = vfmadd231ps_fma(auVar65,auVar57,auVar54);
  auVar42 = vfmadd231ps_fma(auVar41,auVar254,auVar40);
  auVar43 = vfmadd231ps_fma(auVar49,auVar254,auVar48);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar275 = ZEXT1664(auVar40);
  auVar44 = vfmadd231ps_fma(auVar55,auVar254,auVar53);
  auVar41 = vandps_avx512vl(auVar60,auVar40);
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  uVar39 = vcmpps_avx512vl(auVar41,auVar183,1);
  bVar33 = (bool)((byte)uVar39 & 1);
  auVar45._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar60._0_4_;
  bVar33 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar60._4_4_;
  bVar33 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar60._8_4_;
  bVar33 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar60._12_4_;
  auVar41 = vandps_avx512vl(auVar59,auVar40);
  uVar39 = vcmpps_avx512vl(auVar41,auVar183,1);
  bVar33 = (bool)((byte)uVar39 & 1);
  auVar46._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar59._0_4_;
  bVar33 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar59._4_4_;
  bVar33 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar59._8_4_;
  bVar33 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar59._12_4_;
  auVar40 = vandps_avx512vl(auVar61,auVar40);
  uVar39 = vcmpps_avx512vl(auVar40,auVar183,1);
  bVar33 = (bool)((byte)uVar39 & 1);
  auVar47._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar61._0_4_;
  bVar33 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar61._4_4_;
  bVar33 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar61._8_4_;
  bVar33 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar61._12_4_;
  auVar41 = vrcp14ps_avx512vl(auVar45);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar45,auVar41,auVar184);
  auVar60 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
  auVar41 = vrcp14ps_avx512vl(auVar46);
  auVar40 = vfnmadd213ps_fma(auVar46,auVar41,auVar184);
  auVar61 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
  auVar41 = vrcp14ps_avx512vl(auVar47);
  auVar40 = vfnmadd213ps_fma(auVar47,auVar41,auVar184);
  auVar20 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
  fVar102 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar170._4_4_ = fVar102;
  auVar170._0_4_ = fVar102;
  auVar170._8_4_ = fVar102;
  auVar170._12_4_ = fVar102;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar27 * 7 + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar27 * 0xb + 6);
  auVar41 = vpmovsxwd_avx(auVar41);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar48 = vsubps_avx(auVar41,auVar40);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar27 * 9 + 6);
  auVar41 = vpmovsxwd_avx(auVar49);
  auVar49 = vfmadd213ps_fma(auVar48,auVar170,auVar40);
  auVar40 = vcvtdq2ps_avx(auVar41);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar27 * 0xd + 6);
  auVar41 = vpmovsxwd_avx(auVar48);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar48 = vfmadd213ps_fma(auVar41,auVar170,auVar40);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar27 * 0x12 + 6);
  auVar40 = vpmovsxwd_avx(auVar55);
  auVar40 = vcvtdq2ps_avx(auVar40);
  uVar39 = (ulong)(uint)((int)(uVar27 * 5) << 2);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar27 * 2 + uVar39 + 6);
  auVar41 = vpmovsxwd_avx(auVar52);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar55 = vfmadd213ps_fma(auVar41,auVar170,auVar40);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar39 + 6);
  auVar40 = vpmovsxwd_avx(auVar53);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar27 * 0x18 + 6);
  auVar41 = vpmovsxwd_avx(auVar54);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar52 = vfmadd213ps_fma(auVar41,auVar170,auVar40);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar27 * 0x1d + 6);
  auVar40 = vpmovsxwd_avx(auVar56);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar27 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar41 = vpmovsxwd_avx(auVar57);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar53 = vfmadd213ps_fma(auVar41,auVar170,auVar40);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar27) + 6);
  auVar40 = vpmovsxwd_avx(auVar58);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar27 * 0x23 + 6);
  auVar41 = vpmovsxwd_avx(auVar59);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar41 = vfmadd213ps_fma(auVar41,auVar170,auVar40);
  auVar40 = vsubps_avx(auVar49,auVar42);
  auVar171._0_4_ = auVar60._0_4_ * auVar40._0_4_;
  auVar171._4_4_ = auVar60._4_4_ * auVar40._4_4_;
  auVar171._8_4_ = auVar60._8_4_ * auVar40._8_4_;
  auVar171._12_4_ = auVar60._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar48,auVar42);
  auVar62._0_4_ = auVar60._0_4_ * auVar40._0_4_;
  auVar62._4_4_ = auVar60._4_4_ * auVar40._4_4_;
  auVar62._8_4_ = auVar60._8_4_ * auVar40._8_4_;
  auVar62._12_4_ = auVar60._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar55,auVar43);
  auVar151._0_4_ = auVar61._0_4_ * auVar40._0_4_;
  auVar151._4_4_ = auVar61._4_4_ * auVar40._4_4_;
  auVar151._8_4_ = auVar61._8_4_ * auVar40._8_4_;
  auVar151._12_4_ = auVar61._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar52,auVar43);
  auVar64._0_4_ = auVar61._0_4_ * auVar40._0_4_;
  auVar64._4_4_ = auVar61._4_4_ * auVar40._4_4_;
  auVar64._8_4_ = auVar61._8_4_ * auVar40._8_4_;
  auVar64._12_4_ = auVar61._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar53,auVar44);
  auVar67._0_4_ = auVar20._0_4_ * auVar40._0_4_;
  auVar67._4_4_ = auVar20._4_4_ * auVar40._4_4_;
  auVar67._8_4_ = auVar20._8_4_ * auVar40._8_4_;
  auVar67._12_4_ = auVar20._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar41,auVar44);
  auVar50._0_4_ = auVar20._0_4_ * auVar40._0_4_;
  auVar50._4_4_ = auVar20._4_4_ * auVar40._4_4_;
  auVar50._8_4_ = auVar20._8_4_ * auVar40._8_4_;
  auVar50._12_4_ = auVar20._12_4_ * auVar40._12_4_;
  auVar40 = vpminsd_avx(auVar171,auVar62);
  auVar41 = vpminsd_avx(auVar151,auVar64);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar41 = vpminsd_avx(auVar67,auVar50);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar60._4_4_ = uVar103;
  auVar60._0_4_ = uVar103;
  auVar60._8_4_ = uVar103;
  auVar60._12_4_ = uVar103;
  auVar41 = vmaxps_avx512vl(auVar41,auVar60);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar61._8_4_ = 0x3f7ffffa;
  auVar61._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar61._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar40,auVar61);
  auVar40 = vpmaxsd_avx(auVar171,auVar62);
  auVar41 = vpmaxsd_avx(auVar151,auVar64);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar41 = vpmaxsd_avx(auVar67,auVar50);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar20._4_4_ = uVar103;
  auVar20._0_4_ = uVar103;
  auVar20._8_4_ = uVar103;
  auVar20._12_4_ = uVar103;
  auVar41 = vminps_avx512vl(auVar41,auVar20);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar42._8_4_ = 0x3f800003;
  auVar42._0_8_ = 0x3f8000033f800003;
  auVar42._12_4_ = 0x3f800003;
  auVar40 = vmulps_avx512vl(auVar40,auVar42);
  auVar41 = vpbroadcastd_avx512vl();
  uVar18 = vcmpps_avx512vl(local_3a0,auVar40,2);
  uVar39 = vpcmpgtd_avx512vl(auVar41,_DAT_01f7fcf0);
  uVar39 = ((byte)uVar18 & 0xf) & uVar39;
  if ((char)uVar39 == '\0') {
    return false;
  }
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar40 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar270 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar274 = ZEXT1664(auVar40);
LAB_01b9225c:
  lVar29 = 0;
  for (uVar27 = uVar39; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar34 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar34].ptr;
  fVar102 = (pGVar8->time_range).lower;
  fVar102 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar102) / ((pGVar8->time_range).upper - fVar102));
  auVar40 = vroundss_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102),9);
  auVar41 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar40 = vminss_avx(auVar40,auVar41);
  auVar46 = auVar270._0_16_;
  auVar42 = vmaxss_avx512f(auVar46,auVar40);
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar29 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar31 = (long)(int)auVar42._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar31);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar31);
  auVar40 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar27);
  lVar29 = uVar27 + 1;
  auVar41 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar29);
  lVar1 = uVar27 + 2;
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar27 + 3;
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar31);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar31);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar27);
  auVar52 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar29);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar31);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar31);
  auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar27);
  auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar29);
  auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  local_1e0 = vpbroadcastd_avx512vl();
  lVar11 = *(long *)(lVar10 + 0x38 + lVar31);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar31);
  auVar60 = *(undefined1 (*) [16])(lVar11 + uVar27 * lVar10);
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar29 * lVar10);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar87._16_16_ = local_1e0._16_16_;
  auVar42 = vsubss_avx512f(ZEXT416((uint)fVar102),auVar42);
  auVar87._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar43 = vmulps_avx512vl(auVar48,auVar87._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar49,auVar87._0_16_);
  auVar44 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar41,auVar43);
  auVar44 = vaddps_avx512vl(auVar40,auVar44);
  auVar64 = auVar274._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar64);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar40,auVar64);
  auVar45 = vmulps_avx512vl(auVar54,auVar87._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar53,auVar87._0_16_);
  auVar46 = vxorps_avx512vl(auVar46,auVar46);
  auVar46 = vfmadd213ps_avx512vl(auVar46,auVar52,auVar45);
  auVar47 = vaddps_avx512vl(auVar55,auVar46);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar64);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar55,auVar64);
  auVar46 = vxorps_avx512vl(auVar46,auVar46);
  auVar46 = vfmadd213ps_avx512vl(auVar46,auVar49,auVar48);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar41,auVar87._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar40,auVar87._0_16_);
  auVar48 = vmulps_avx512vl(auVar48,auVar64);
  auVar49 = vfnmadd231ps_avx512vl(auVar48,auVar64,auVar49);
  auVar41 = vfmadd231ps_avx512vl(auVar49,auVar87._0_16_,auVar41);
  auVar50 = vfnmadd231ps_avx512vl(auVar41,auVar87._0_16_,auVar40);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar53,auVar54);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar52,auVar87._0_16_);
  auVar51 = vfmadd231ps_avx512vl(auVar40,auVar55,auVar87._0_16_);
  auVar40 = vmulps_avx512vl(auVar54,auVar64);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar64,auVar53);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar87._0_16_,auVar52);
  auVar52 = vfnmadd231ps_avx512vl(auVar40,auVar87._0_16_,auVar55);
  auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar41 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  fVar125 = auVar43._0_4_;
  auVar152._0_4_ = fVar125 * auVar41._0_4_;
  fVar137 = auVar43._4_4_;
  auVar152._4_4_ = fVar137 * auVar41._4_4_;
  fVar138 = auVar43._8_4_;
  auVar152._8_4_ = fVar138 * auVar41._8_4_;
  fVar139 = auVar43._12_4_;
  auVar152._12_4_ = fVar139 * auVar41._12_4_;
  auVar41 = vfmsub231ps_avx512vl(auVar152,auVar40,auVar47);
  auVar49 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar172._0_4_ = fVar125 * auVar41._0_4_;
  auVar172._4_4_ = fVar137 * auVar41._4_4_;
  auVar172._8_4_ = fVar138 * auVar41._8_4_;
  auVar172._12_4_ = fVar139 * auVar41._12_4_;
  auVar40 = vfmsub231ps_avx512vl(auVar172,auVar40,auVar45);
  auVar48 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar41 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar102 = auVar50._0_4_;
  auVar195._0_4_ = auVar41._0_4_ * fVar102;
  fVar110 = auVar50._4_4_;
  auVar195._4_4_ = auVar41._4_4_ * fVar110;
  fVar238 = auVar50._8_4_;
  auVar195._8_4_ = auVar41._8_4_ * fVar238;
  fVar222 = auVar50._12_4_;
  auVar195._12_4_ = auVar41._12_4_ * fVar222;
  auVar41 = vfmsub231ps_fma(auVar195,auVar40,auVar51);
  auVar55 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar196._0_4_ = auVar41._0_4_ * fVar102;
  auVar196._4_4_ = auVar41._4_4_ * fVar110;
  auVar196._8_4_ = auVar41._8_4_ * fVar238;
  auVar196._12_4_ = auVar41._12_4_ * fVar222;
  auVar40 = vfmsub231ps_fma(auVar196,auVar40,auVar52);
  auVar52 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar49,auVar49,0x7f);
  auVar84._4_28_ = auVar87._4_28_;
  auVar84._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar84._0_16_);
  auVar53 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  auVar54 = vmulss_avx512f(auVar54,auVar41);
  auVar41 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar41._0_4_ * auVar41._0_4_)));
  auVar41 = vsubss_avx512f(auVar53,auVar41);
  auVar204._0_4_ = auVar41._0_4_;
  auVar204._4_4_ = auVar204._0_4_;
  auVar204._8_4_ = auVar204._0_4_;
  auVar204._12_4_ = auVar204._0_4_;
  auVar53 = vmulps_avx512vl(auVar49,auVar204);
  auVar41 = vdpps_avx(auVar49,auVar48,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar54,auVar48);
  fVar233 = auVar41._0_4_;
  auVar153._0_4_ = fVar233 * auVar49._0_4_;
  auVar153._4_4_ = fVar233 * auVar49._4_4_;
  auVar153._8_4_ = fVar233 * auVar49._8_4_;
  auVar153._12_4_ = fVar233 * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar48,auVar153);
  auVar41 = vrcp14ss_avx512f(auVar87._0_16_,auVar84._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
  fVar233 = auVar41._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar86._16_16_ = auVar87._16_16_;
  auVar86._0_16_ = auVar87._0_16_;
  auVar69._4_28_ = auVar86._4_28_;
  auVar69._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar69._0_16_);
  auVar48 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar234 = auVar41._0_4_;
  fVar140 = auVar48._0_4_ - auVar54._0_4_ * fVar234 * fVar234 * fVar234;
  auVar205._0_4_ = fVar140 * auVar55._0_4_;
  auVar205._4_4_ = fVar140 * auVar55._4_4_;
  auVar205._8_4_ = fVar140 * auVar55._8_4_;
  auVar205._12_4_ = fVar140 * auVar55._12_4_;
  auVar41 = vdpps_avx(auVar55,auVar52,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar48,auVar52);
  fVar234 = auVar41._0_4_;
  auVar104._0_4_ = fVar234 * auVar55._0_4_;
  auVar104._4_4_ = fVar234 * auVar55._4_4_;
  auVar104._8_4_ = fVar234 * auVar55._8_4_;
  auVar104._12_4_ = fVar234 * auVar55._12_4_;
  auVar41 = vsubps_avx(auVar48,auVar104);
  auVar48 = vrcp14ss_avx512f(auVar87._0_16_,auVar69._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  fVar234 = auVar48._0_4_ * auVar40._0_4_;
  auVar48 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar55 = vmulps_avx512vl(auVar48,auVar53);
  auVar52 = vsubps_avx512vl(auVar44,auVar55);
  auVar40 = vshufps_avx(auVar43,auVar43,0xff);
  auVar40 = vmulps_avx512vl(auVar40,auVar53);
  auVar141._0_4_ = auVar40._0_4_ + auVar48._0_4_ * auVar204._0_4_ * fVar233 * auVar49._0_4_;
  auVar141._4_4_ = auVar40._4_4_ + auVar48._4_4_ * auVar204._0_4_ * fVar233 * auVar49._4_4_;
  auVar141._8_4_ = auVar40._8_4_ + auVar48._8_4_ * auVar204._0_4_ * fVar233 * auVar49._8_4_;
  auVar141._12_4_ = auVar40._12_4_ + auVar48._12_4_ * auVar204._0_4_ * fVar233 * auVar49._12_4_;
  auVar40 = vsubps_avx(auVar43,auVar141);
  auVar53 = vaddps_avx512vl(auVar44,auVar55);
  auVar49 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar240._0_4_ = auVar205._0_4_ * auVar49._0_4_;
  auVar240._4_4_ = auVar205._4_4_ * auVar49._4_4_;
  auVar240._8_4_ = auVar205._8_4_ * auVar49._8_4_;
  auVar240._12_4_ = auVar205._12_4_ * auVar49._12_4_;
  auVar54 = vsubps_avx512vl(auVar46,auVar240);
  auVar48 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar55 = vmulps_avx512vl(auVar48,auVar205);
  auVar154._0_4_ = auVar55._0_4_ + auVar49._0_4_ * fVar140 * auVar41._0_4_ * fVar234;
  auVar154._4_4_ = auVar55._4_4_ + auVar49._4_4_ * fVar140 * auVar41._4_4_ * fVar234;
  auVar154._8_4_ = auVar55._8_4_ + auVar49._8_4_ * fVar140 * auVar41._8_4_ * fVar234;
  auVar154._12_4_ = auVar55._12_4_ + auVar49._12_4_ * fVar140 * auVar41._12_4_ * fVar234;
  auVar41 = vsubps_avx(auVar50,auVar154);
  auVar43 = vaddps_avx512vl(auVar46,auVar240);
  auVar185._0_4_ = auVar52._0_4_ + auVar40._0_4_ * 0.33333334;
  auVar185._4_4_ = auVar52._4_4_ + auVar40._4_4_ * 0.33333334;
  auVar185._8_4_ = auVar52._8_4_ + auVar40._8_4_ * 0.33333334;
  auVar185._12_4_ = auVar52._12_4_ + auVar40._12_4_ * 0.33333334;
  auVar155._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar155._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar155._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar155._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar55 = vsubps_avx(auVar54,auVar155);
  auVar156._0_4_ = (fVar125 + auVar141._0_4_) * 0.33333334;
  auVar156._4_4_ = (fVar137 + auVar141._4_4_) * 0.33333334;
  auVar156._8_4_ = (fVar138 + auVar141._8_4_) * 0.33333334;
  auVar156._12_4_ = (fVar139 + auVar141._12_4_) * 0.33333334;
  auVar44 = vaddps_avx512vl(auVar53,auVar156);
  auVar173._0_4_ = (fVar102 + auVar154._0_4_) * 0.33333334;
  auVar173._4_4_ = (fVar110 + auVar154._4_4_) * 0.33333334;
  auVar173._8_4_ = (fVar238 + auVar154._8_4_) * 0.33333334;
  auVar173._12_4_ = (fVar222 + auVar154._12_4_) * 0.33333334;
  auVar45 = vsubps_avx512vl(auVar43,auVar173);
  auVar40 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar41 = vmulps_avx512vl(auVar59,auVar87._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar58,auVar87._0_16_);
  auVar49 = vxorps_avx512vl(auVar48,auVar48);
  auVar49 = vfmadd213ps_avx512vl(auVar49,auVar57,auVar41);
  auVar47 = vaddps_avx512vl(auVar56,auVar49);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar57,auVar64);
  auVar50 = vfnmadd231ps_avx512vl(auVar41,auVar56,auVar64);
  auVar41 = vmulps_avx512vl(auVar40,auVar87._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar20,auVar87._0_16_);
  auVar49 = vxorps_avx512vl(auVar46,auVar46);
  auVar49 = vfmadd213ps_avx512vl(auVar49,auVar61,auVar41);
  auVar48 = vaddps_avx512vl(auVar60,auVar49);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar61,auVar64);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar60,auVar64);
  auVar49 = vxorps_avx512vl(auVar49,auVar49);
  auVar49 = vfmadd213ps_avx512vl(auVar49,auVar58,auVar59);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar57,auVar87._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar49,auVar56,auVar87._0_16_);
  auVar49 = vmulps_avx512vl(auVar59,auVar64);
  auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar64,auVar58);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar87._0_16_,auVar57);
  auVar56 = vfnmadd231ps_avx512vl(auVar49,auVar87._0_16_,auVar56);
  auVar49 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar20,auVar40);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar61,auVar87._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar49,auVar60,auVar87._0_16_);
  auVar40 = vmulps_avx512vl(auVar40,auVar64);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar64,auVar20);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar87._0_16_,auVar61);
  auVar58 = vfnmadd231ps_avx512vl(auVar40,auVar87._0_16_,auVar60);
  auVar40 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar49 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  fVar238 = auVar50._0_4_;
  auVar255._0_4_ = fVar238 * auVar49._0_4_;
  fVar222 = auVar50._4_4_;
  auVar255._4_4_ = fVar222 * auVar49._4_4_;
  fVar233 = auVar50._8_4_;
  auVar255._8_4_ = fVar233 * auVar49._8_4_;
  fVar234 = auVar50._12_4_;
  auVar255._12_4_ = fVar234 * auVar49._12_4_;
  auVar49 = vfmsub231ps_avx512vl(auVar255,auVar40,auVar48);
  auVar49 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar48 = vshufps_avx512vl(auVar41,auVar41,0xc9);
  auVar262._0_4_ = fVar238 * auVar48._0_4_;
  auVar262._4_4_ = fVar222 * auVar48._4_4_;
  auVar262._8_4_ = fVar233 * auVar48._8_4_;
  auVar262._12_4_ = fVar234 * auVar48._12_4_;
  auVar40 = vfmsub231ps_avx512vl(auVar262,auVar40,auVar41);
  auVar48 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar41 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar40 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar40 = vmulps_avx512vl(auVar56,auVar40);
  auVar40 = vfmsub231ps_avx512vl(auVar40,auVar41,auVar57);
  auVar57 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar59 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  auVar40 = vdpps_avx(auVar49,auVar49,0x7f);
  auVar59 = vmulps_avx512vl(auVar56,auVar59);
  auVar41 = vfmsub231ps_avx512vl(auVar59,auVar41,auVar58);
  auVar58 = vshufps_avx512vl(auVar41,auVar41,0xc9);
  auVar71._16_16_ = auVar87._16_16_;
  auVar71._0_16_ = auVar87._0_16_;
  auVar70._4_28_ = auVar71._4_28_;
  auVar70._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar70._0_16_);
  auVar59 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar60 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  auVar60 = vmulss_avx512f(auVar60,auVar41);
  auVar41 = vmulss_avx512f(auVar41,auVar41);
  auVar41 = vmulss_avx512f(auVar60,auVar41);
  auVar41 = vsubss_avx512f(auVar59,auVar41);
  auVar59 = vbroadcastss_avx512vl(auVar41);
  auVar60 = vmulps_avx512vl(auVar49,auVar59);
  auVar41 = vdpps_avx(auVar49,auVar48,0x7f);
  auVar61 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar61,auVar48);
  fVar102 = auVar41._0_4_;
  auVar157._0_4_ = auVar49._0_4_ * fVar102;
  auVar157._4_4_ = auVar49._4_4_ * fVar102;
  auVar157._8_4_ = auVar49._8_4_ * fVar102;
  auVar157._12_4_ = auVar49._12_4_ * fVar102;
  auVar41 = vsubps_avx(auVar48,auVar157);
  auVar49 = vrcp14ss_avx512f(auVar87._0_16_,auVar70._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar49,ZEXT416(0x40000000));
  fVar102 = auVar49._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar111._0_4_ = fVar102 * auVar41._0_4_;
  auVar111._4_4_ = fVar102 * auVar41._4_4_;
  auVar111._8_4_ = fVar102 * auVar41._8_4_;
  auVar111._12_4_ = fVar102 * auVar41._12_4_;
  auVar49 = vmulps_avx512vl(auVar59,auVar111);
  auVar72._16_16_ = auVar87._16_16_;
  auVar72._0_16_ = auVar87._0_16_;
  auVar73._4_28_ = auVar72._4_28_;
  auVar73._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar73._0_16_);
  auVar48 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar59 = vmulss_avx512f(auVar59,auVar41);
  auVar41 = vmulss_avx512f(auVar59,ZEXT416((uint)(auVar41._0_4_ * auVar41._0_4_)));
  fVar110 = auVar48._0_4_ - auVar41._0_4_;
  auVar263._0_4_ = auVar57._0_4_ * fVar110;
  auVar263._4_4_ = auVar57._4_4_ * fVar110;
  auVar263._8_4_ = auVar57._8_4_ * fVar110;
  auVar263._12_4_ = auVar57._12_4_ * fVar110;
  auVar41 = vdpps_avx(auVar57,auVar58,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar40);
  auVar48 = vmulps_avx512vl(auVar48,auVar58);
  fVar102 = auVar41._0_4_;
  auVar174._0_4_ = auVar57._0_4_ * fVar102;
  auVar174._4_4_ = auVar57._4_4_ * fVar102;
  auVar174._8_4_ = auVar57._8_4_ * fVar102;
  auVar174._12_4_ = auVar57._12_4_ * fVar102;
  auVar41 = vsubps_avx(auVar48,auVar174);
  auVar48 = vrcp14ss_avx512f(auVar87._0_16_,auVar73._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  auVar276 = ZEXT464(0x3f800000);
  fVar102 = auVar40._0_4_ * auVar48._0_4_;
  auVar48 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar57 = vmulps_avx512vl(auVar48,auVar60);
  auVar58 = vsubps_avx512vl(auVar47,auVar57);
  auVar40 = vshufps_avx(auVar50,auVar50,0xff);
  auVar40 = vmulps_avx512vl(auVar40,auVar60);
  auVar112._0_4_ = auVar40._0_4_ + auVar48._0_4_ * auVar49._0_4_;
  auVar112._4_4_ = auVar40._4_4_ + auVar48._4_4_ * auVar49._4_4_;
  auVar112._8_4_ = auVar40._8_4_ + auVar48._8_4_ * auVar49._8_4_;
  auVar112._12_4_ = auVar40._12_4_ + auVar48._12_4_ * auVar49._12_4_;
  auVar40 = vsubps_avx(auVar50,auVar112);
  auVar49 = vaddps_avx512vl(auVar47,auVar57);
  auVar48 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar241._0_4_ = auVar48._0_4_ * auVar263._0_4_;
  auVar241._4_4_ = auVar48._4_4_ * auVar263._4_4_;
  auVar241._8_4_ = auVar48._8_4_ * auVar263._8_4_;
  auVar241._12_4_ = auVar48._12_4_ * auVar263._12_4_;
  auVar57 = vsubps_avx512vl(auVar46,auVar241);
  auVar59 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar59 = vmulps_avx512vl(auVar59,auVar263);
  auVar158._0_4_ = auVar59._0_4_ + auVar48._0_4_ * fVar110 * auVar41._0_4_ * fVar102;
  auVar158._4_4_ = auVar59._4_4_ + auVar48._4_4_ * fVar110 * auVar41._4_4_ * fVar102;
  auVar158._8_4_ = auVar59._8_4_ + auVar48._8_4_ * fVar110 * auVar41._8_4_ * fVar102;
  auVar158._12_4_ = auVar59._12_4_ + auVar48._12_4_ * fVar110 * auVar41._12_4_ * fVar102;
  auVar41 = vsubps_avx(auVar56,auVar158);
  auVar48 = vaddps_avx512vl(auVar46,auVar241);
  auVar175._0_4_ = auVar58._0_4_ + auVar40._0_4_ * 0.33333334;
  auVar175._4_4_ = auVar58._4_4_ + auVar40._4_4_ * 0.33333334;
  auVar175._8_4_ = auVar58._8_4_ + auVar40._8_4_ * 0.33333334;
  auVar175._12_4_ = auVar58._12_4_ + auVar40._12_4_ * 0.33333334;
  auVar206._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar206._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar206._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar206._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar40 = vsubps_avx(auVar57,auVar206);
  auVar113._0_4_ = auVar49._0_4_ + (fVar238 + auVar112._0_4_) * 0.33333334;
  auVar113._4_4_ = auVar49._4_4_ + (fVar222 + auVar112._4_4_) * 0.33333334;
  auVar113._8_4_ = auVar49._8_4_ + (fVar233 + auVar112._8_4_) * 0.33333334;
  auVar113._12_4_ = auVar49._12_4_ + (fVar234 + auVar112._12_4_) * 0.33333334;
  auVar159._0_4_ = (auVar56._0_4_ + auVar158._0_4_) * 0.33333334;
  auVar159._4_4_ = (auVar56._4_4_ + auVar158._4_4_) * 0.33333334;
  auVar159._8_4_ = (auVar56._8_4_ + auVar158._8_4_) * 0.33333334;
  auVar159._12_4_ = (auVar56._12_4_ + auVar158._12_4_) * 0.33333334;
  auVar41 = vsubps_avx(auVar48,auVar159);
  auVar56 = vbroadcastss_avx512vl(auVar42);
  auVar59 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
  auVar264._0_4_ = auVar59._0_4_;
  auVar264._4_4_ = auVar264._0_4_;
  auVar264._8_4_ = auVar264._0_4_;
  auVar264._12_4_ = auVar264._0_4_;
  auVar58 = vmulps_avx512vl(auVar56,auVar58);
  auVar59 = vmulps_avx512vl(auVar56,auVar175);
  auVar40 = vmulps_avx512vl(auVar56,auVar40);
  auVar256._0_4_ = auVar56._0_4_ * auVar57._0_4_;
  auVar256._4_4_ = auVar56._4_4_ * auVar57._4_4_;
  auVar256._8_4_ = auVar56._8_4_ * auVar57._8_4_;
  auVar256._12_4_ = auVar56._12_4_ * auVar57._12_4_;
  local_320 = vfmadd231ps_avx512vl(auVar58,auVar264,auVar52);
  local_330 = vfmadd231ps_avx512vl(auVar59,auVar264,auVar185);
  local_340 = vfmadd231ps_avx512vl(auVar40,auVar264,auVar55);
  local_350 = vfmadd231ps_fma(auVar256,auVar264,auVar54);
  auVar40 = vmulps_avx512vl(auVar56,auVar49);
  auVar49 = vmulps_avx512vl(auVar56,auVar113);
  auVar41 = vmulps_avx512vl(auVar56,auVar41);
  auVar250._0_4_ = auVar56._0_4_ * auVar48._0_4_;
  auVar250._4_4_ = auVar56._4_4_ * auVar48._4_4_;
  auVar250._8_4_ = auVar56._8_4_ * auVar48._8_4_;
  auVar250._12_4_ = auVar56._12_4_ * auVar48._12_4_;
  _local_360 = vfmadd231ps_avx512vl(auVar40,auVar264,auVar53);
  _local_370 = vfmadd231ps_avx512vl(auVar49,auVar264,auVar44);
  _local_380 = vfmadd231ps_avx512vl(auVar41,auVar264,auVar45);
  _local_390 = vfmadd231ps_fma(auVar250,auVar264,auVar43);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2a0 = vsubps_avx512vl(local_320,auVar40);
  uVar103 = local_2a0._0_4_;
  auVar114._4_4_ = uVar103;
  auVar114._0_4_ = uVar103;
  auVar114._8_4_ = uVar103;
  auVar114._12_4_ = uVar103;
  auVar41 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar49 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar102 = pre->ray_space[k].vz.field_0.m128[0];
  fVar110 = pre->ray_space[k].vz.field_0.m128[1];
  fVar238 = pre->ray_space[k].vz.field_0.m128[2];
  fVar222 = pre->ray_space[k].vz.field_0.m128[3];
  auVar105._0_4_ = fVar102 * auVar49._0_4_;
  auVar105._4_4_ = fVar110 * auVar49._4_4_;
  auVar105._8_4_ = fVar238 * auVar49._8_4_;
  auVar105._12_4_ = fVar222 * auVar49._12_4_;
  auVar41 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar5,auVar41);
  auVar54 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar4,auVar114);
  local_2b0 = vsubps_avx512vl(local_330,auVar40);
  uVar103 = local_2b0._0_4_;
  auVar126._4_4_ = uVar103;
  auVar126._0_4_ = uVar103;
  auVar126._8_4_ = uVar103;
  auVar126._12_4_ = uVar103;
  auVar41 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar49 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar115._0_4_ = fVar102 * auVar49._0_4_;
  auVar115._4_4_ = fVar110 * auVar49._4_4_;
  auVar115._8_4_ = fVar238 * auVar49._8_4_;
  auVar115._12_4_ = fVar222 * auVar49._12_4_;
  auVar41 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar5,auVar41);
  auVar56 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar4,auVar126);
  local_2c0 = vsubps_avx512vl(local_340,auVar40);
  uVar103 = local_2c0._0_4_;
  auVar127._4_4_ = uVar103;
  auVar127._0_4_ = uVar103;
  auVar127._8_4_ = uVar103;
  auVar127._12_4_ = uVar103;
  auVar41 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar49 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar197._0_4_ = auVar49._0_4_ * fVar102;
  auVar197._4_4_ = auVar49._4_4_ * fVar110;
  auVar197._8_4_ = auVar49._8_4_ * fVar238;
  auVar197._12_4_ = auVar49._12_4_ * fVar222;
  auVar41 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar41);
  auVar57 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar4,auVar127);
  local_2d0 = vsubps_avx(local_350,auVar40);
  uVar103 = local_2d0._0_4_;
  auVar128._4_4_ = uVar103;
  auVar128._0_4_ = uVar103;
  auVar128._8_4_ = uVar103;
  auVar128._12_4_ = uVar103;
  auVar41 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar49 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar207._0_4_ = auVar49._0_4_ * fVar102;
  auVar207._4_4_ = auVar49._4_4_ * fVar110;
  auVar207._8_4_ = auVar49._8_4_ * fVar238;
  auVar207._12_4_ = auVar49._12_4_ * fVar222;
  auVar41 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar41);
  auVar58 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar4,auVar128);
  local_2e0 = vsubps_avx512vl(_local_360,auVar40);
  uVar103 = local_2e0._0_4_;
  auVar129._4_4_ = uVar103;
  auVar129._0_4_ = uVar103;
  auVar129._8_4_ = uVar103;
  auVar129._12_4_ = uVar103;
  auVar41 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar49 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar217._0_4_ = auVar49._0_4_ * fVar102;
  auVar217._4_4_ = auVar49._4_4_ * fVar110;
  auVar217._8_4_ = auVar49._8_4_ * fVar238;
  auVar217._12_4_ = auVar49._12_4_ * fVar222;
  auVar41 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar41);
  auVar59 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar4,auVar129);
  local_2f0 = vsubps_avx512vl(_local_370,auVar40);
  uVar103 = local_2f0._0_4_;
  auVar130._4_4_ = uVar103;
  auVar130._0_4_ = uVar103;
  auVar130._8_4_ = uVar103;
  auVar130._12_4_ = uVar103;
  auVar41 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar49 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar223._0_4_ = auVar49._0_4_ * fVar102;
  auVar223._4_4_ = auVar49._4_4_ * fVar110;
  auVar223._8_4_ = auVar49._8_4_ * fVar238;
  auVar223._12_4_ = auVar49._12_4_ * fVar222;
  auVar41 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar41);
  auVar60 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar4,auVar130);
  local_300 = vsubps_avx512vl(_local_380,auVar40);
  uVar103 = local_300._0_4_;
  auVar131._4_4_ = uVar103;
  auVar131._0_4_ = uVar103;
  auVar131._8_4_ = uVar103;
  auVar131._12_4_ = uVar103;
  auVar41 = vshufps_avx(local_300,local_300,0x55);
  auVar49 = vshufps_avx(local_300,local_300,0xaa);
  auVar242._0_4_ = auVar49._0_4_ * fVar102;
  auVar242._4_4_ = auVar49._4_4_ * fVar110;
  auVar242._8_4_ = auVar49._8_4_ * fVar238;
  auVar242._12_4_ = auVar49._12_4_ * fVar222;
  auVar41 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar5,auVar41);
  auVar61 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar4,auVar131);
  local_310 = vsubps_avx(_local_390,auVar40);
  uVar103 = local_310._0_4_;
  auVar118._4_4_ = uVar103;
  auVar118._0_4_ = uVar103;
  auVar118._8_4_ = uVar103;
  auVar118._12_4_ = uVar103;
  auVar40 = vshufps_avx(local_310,local_310,0x55);
  auVar41 = vshufps_avx(local_310,local_310,0xaa);
  auVar176._0_4_ = fVar102 * auVar41._0_4_;
  auVar176._4_4_ = fVar110 * auVar41._4_4_;
  auVar176._8_4_ = fVar238 * auVar41._8_4_;
  auVar176._12_4_ = fVar222 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar40);
  auVar20 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar118);
  auVar53 = vmovlhps_avx512f(auVar54,auVar59);
  auVar49 = vmovlhps_avx(auVar56,auVar60);
  auVar48 = vmovlhps_avx(auVar57,auVar61);
  auVar55 = vmovlhps_avx(auVar58,auVar20);
  auVar41 = vminps_avx512vl(auVar53,auVar49);
  auVar52 = vmaxps_avx512vl(auVar53,auVar49);
  auVar40 = vminps_avx(auVar48,auVar55);
  auVar41 = vminps_avx(auVar41,auVar40);
  auVar40 = vmaxps_avx(auVar48,auVar55);
  auVar40 = vmaxps_avx(auVar52,auVar40);
  auVar52 = vshufpd_avx(auVar41,auVar41,3);
  auVar41 = vminps_avx(auVar41,auVar52);
  auVar52 = vshufpd_avx(auVar40,auVar40,3);
  auVar40 = vmaxps_avx(auVar40,auVar52);
  auVar41 = vandps_avx512vl(auVar41,auVar275._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar275._0_16_);
  auVar40 = vmaxps_avx(auVar41,auVar40);
  auVar41 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar41,auVar40);
  fVar110 = auVar40._0_4_ * 9.536743e-07;
  auVar41 = vmovddup_avx512vl(auVar54);
  auVar52 = vmovddup_avx512vl(auVar56);
  auVar198._0_8_ = auVar57._0_8_;
  auVar198._8_8_ = auVar198._0_8_;
  auVar208._0_8_ = auVar58._0_8_;
  auVar208._8_8_ = auVar208._0_8_;
  local_260 = vbroadcastss_avx512vl(ZEXT416((uint)fVar110));
  auVar40 = vxorps_avx512vl(local_260._0_16_,auVar51);
  local_1c0 = auVar40._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  bVar33 = false;
  uVar27 = 0;
  fVar102 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx512vl(auVar49,auVar53);
  local_280 = vsubps_avx(auVar48,auVar49);
  local_290 = vsubps_avx(auVar55,auVar48);
  local_3b0 = vsubps_avx512vl(_local_360,local_320);
  local_3c0 = vsubps_avx512vl(_local_370,local_330);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  _local_3e0 = vsubps_avx(_local_390,local_350);
  local_200 = vpbroadcastd_avx512vl();
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar116 = auVar40;
LAB_01b92d59:
  do {
    auVar54 = vshufps_avx(auVar116,auVar116,0x50);
    auVar257._8_4_ = 0x3f800000;
    auVar257._0_8_ = 0x3f8000003f800000;
    auVar257._12_4_ = 0x3f800000;
    auVar261._16_4_ = 0x3f800000;
    auVar261._0_16_ = auVar257;
    auVar261._20_4_ = 0x3f800000;
    auVar261._24_4_ = 0x3f800000;
    auVar261._28_4_ = 0x3f800000;
    auVar56 = vsubps_avx(auVar257,auVar54);
    fVar238 = auVar54._0_4_;
    fVar140 = auVar59._0_4_;
    auVar142._0_4_ = fVar140 * fVar238;
    fVar222 = auVar54._4_4_;
    fVar125 = auVar59._4_4_;
    auVar142._4_4_ = fVar125 * fVar222;
    fVar233 = auVar54._8_4_;
    auVar142._8_4_ = fVar140 * fVar233;
    fVar234 = auVar54._12_4_;
    auVar142._12_4_ = fVar125 * fVar234;
    fVar137 = auVar60._0_4_;
    auVar160._0_4_ = fVar137 * fVar238;
    fVar138 = auVar60._4_4_;
    auVar160._4_4_ = fVar138 * fVar222;
    auVar160._8_4_ = fVar137 * fVar233;
    auVar160._12_4_ = fVar138 * fVar234;
    fVar139 = auVar61._0_4_;
    auVar177._0_4_ = fVar139 * fVar238;
    fVar232 = auVar61._4_4_;
    auVar177._4_4_ = fVar232 * fVar222;
    auVar177._8_4_ = fVar139 * fVar233;
    auVar177._12_4_ = fVar232 * fVar234;
    fVar239 = auVar20._0_4_;
    auVar119._0_4_ = fVar239 * fVar238;
    fVar249 = auVar20._4_4_;
    auVar119._4_4_ = fVar249 * fVar222;
    auVar119._8_4_ = fVar239 * fVar233;
    auVar119._12_4_ = fVar249 * fVar234;
    auVar58 = vfmadd231ps_avx512vl(auVar142,auVar56,auVar41);
    auVar42 = vfmadd231ps_avx512vl(auVar160,auVar56,auVar52);
    auVar57 = vfmadd231ps_fma(auVar177,auVar56,auVar198);
    auVar56 = vfmadd231ps_fma(auVar119,auVar208,auVar56);
    auVar54 = vmovshdup_avx(auVar40);
    fVar222 = auVar40._0_4_;
    fVar238 = (auVar54._0_4_ - fVar222) * 0.04761905;
    auVar146._4_4_ = fVar222;
    auVar146._0_4_ = fVar222;
    auVar146._8_4_ = fVar222;
    auVar146._12_4_ = fVar222;
    auVar146._16_4_ = fVar222;
    auVar146._20_4_ = fVar222;
    auVar146._24_4_ = fVar222;
    auVar146._28_4_ = fVar222;
    auVar79._0_8_ = auVar54._0_8_;
    auVar79._8_8_ = auVar79._0_8_;
    auVar79._16_8_ = auVar79._0_8_;
    auVar79._24_8_ = auVar79._0_8_;
    auVar87 = vsubps_avx(auVar79,auVar146);
    uVar103 = auVar58._0_4_;
    auVar89._4_4_ = uVar103;
    auVar89._0_4_ = uVar103;
    auVar89._8_4_ = uVar103;
    auVar89._12_4_ = uVar103;
    auVar89._16_4_ = uVar103;
    auVar89._20_4_ = uVar103;
    auVar89._24_4_ = uVar103;
    auVar89._28_4_ = uVar103;
    auVar82._8_4_ = 1;
    auVar82._0_8_ = 0x100000001;
    auVar82._12_4_ = 1;
    auVar82._16_4_ = 1;
    auVar82._20_4_ = 1;
    auVar82._24_4_ = 1;
    auVar82._28_4_ = 1;
    auVar86 = ZEXT1632(auVar58);
    auVar84 = vpermps_avx2(auVar82,auVar86);
    auVar69 = vbroadcastss_avx512vl(auVar42);
    auVar85 = ZEXT1632(auVar42);
    auVar70 = vpermps_avx512vl(auVar82,auVar85);
    auVar71 = vbroadcastss_avx512vl(auVar57);
    auVar80 = ZEXT1632(auVar57);
    auVar72 = vpermps_avx512vl(auVar82,auVar80);
    auVar73 = vbroadcastss_avx512vl(auVar56);
    auVar83 = ZEXT1632(auVar56);
    auVar74 = vpermps_avx512vl(auVar82,auVar83);
    auVar220._4_4_ = fVar238;
    auVar220._0_4_ = fVar238;
    auVar220._8_4_ = fVar238;
    auVar220._12_4_ = fVar238;
    auVar220._16_4_ = fVar238;
    auVar220._20_4_ = fVar238;
    auVar220._24_4_ = fVar238;
    auVar220._28_4_ = fVar238;
    auVar81._8_4_ = 2;
    auVar81._0_8_ = 0x200000002;
    auVar81._12_4_ = 2;
    auVar81._16_4_ = 2;
    auVar81._20_4_ = 2;
    auVar81._24_4_ = 2;
    auVar81._28_4_ = 2;
    auVar75 = vpermps_avx512vl(auVar81,auVar86);
    auVar76 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar77 = vpermps_avx512vl(auVar76,auVar86);
    auVar78 = vpermps_avx512vl(auVar81,auVar85);
    auVar79 = vpermps_avx512vl(auVar76,auVar85);
    auVar86 = vpermps_avx2(auVar81,auVar80);
    auVar80 = vpermps_avx512vl(auVar76,auVar80);
    auVar81 = vpermps_avx512vl(auVar81,auVar83);
    auVar82 = vpermps_avx512vl(auVar76,auVar83);
    auVar54 = vfmadd132ps_fma(auVar87,auVar146,_DAT_01faff20);
    auVar87 = vsubps_avx(auVar261,ZEXT1632(auVar54));
    auVar76 = vmulps_avx512vl(auVar69,ZEXT1632(auVar54));
    auVar85 = ZEXT1632(auVar54);
    auVar83 = vmulps_avx512vl(auVar70,auVar85);
    auVar56 = vfmadd231ps_fma(auVar76,auVar87,auVar89);
    auVar57 = vfmadd231ps_fma(auVar83,auVar87,auVar84);
    auVar76 = vmulps_avx512vl(auVar71,auVar85);
    auVar83 = vmulps_avx512vl(auVar72,auVar85);
    auVar69 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar69);
    auVar70 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar70);
    auVar76 = vmulps_avx512vl(auVar73,auVar85);
    auVar89 = ZEXT1632(auVar54);
    auVar74 = vmulps_avx512vl(auVar74,auVar89);
    auVar71 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar71);
    auVar72 = vfmadd231ps_avx512vl(auVar74,auVar87,auVar72);
    fVar233 = auVar54._0_4_;
    fVar234 = auVar54._4_4_;
    auVar74._4_4_ = fVar234 * auVar69._4_4_;
    auVar74._0_4_ = fVar233 * auVar69._0_4_;
    fVar235 = auVar54._8_4_;
    auVar74._8_4_ = fVar235 * auVar69._8_4_;
    fVar236 = auVar54._12_4_;
    auVar74._12_4_ = fVar236 * auVar69._12_4_;
    auVar74._16_4_ = auVar69._16_4_ * 0.0;
    auVar74._20_4_ = auVar69._20_4_ * 0.0;
    auVar74._24_4_ = auVar69._24_4_ * 0.0;
    auVar74._28_4_ = fVar222;
    auVar76._4_4_ = fVar234 * auVar70._4_4_;
    auVar76._0_4_ = fVar233 * auVar70._0_4_;
    auVar76._8_4_ = fVar235 * auVar70._8_4_;
    auVar76._12_4_ = fVar236 * auVar70._12_4_;
    auVar76._16_4_ = auVar70._16_4_ * 0.0;
    auVar76._20_4_ = auVar70._20_4_ * 0.0;
    auVar76._24_4_ = auVar70._24_4_ * 0.0;
    auVar76._28_4_ = auVar84._28_4_;
    auVar56 = vfmadd231ps_fma(auVar74,auVar87,ZEXT1632(auVar56));
    auVar57 = vfmadd231ps_fma(auVar76,auVar87,ZEXT1632(auVar57));
    auVar88._0_4_ = fVar233 * auVar71._0_4_;
    auVar88._4_4_ = fVar234 * auVar71._4_4_;
    auVar88._8_4_ = fVar235 * auVar71._8_4_;
    auVar88._12_4_ = fVar236 * auVar71._12_4_;
    auVar88._16_4_ = auVar71._16_4_ * 0.0;
    auVar88._20_4_ = auVar71._20_4_ * 0.0;
    auVar88._24_4_ = auVar71._24_4_ * 0.0;
    auVar88._28_4_ = 0;
    auVar83._4_4_ = fVar234 * auVar72._4_4_;
    auVar83._0_4_ = fVar233 * auVar72._0_4_;
    auVar83._8_4_ = fVar235 * auVar72._8_4_;
    auVar83._12_4_ = fVar236 * auVar72._12_4_;
    auVar83._16_4_ = auVar72._16_4_ * 0.0;
    auVar83._20_4_ = auVar72._20_4_ * 0.0;
    auVar83._24_4_ = auVar72._24_4_ * 0.0;
    auVar83._28_4_ = auVar71._28_4_;
    auVar58 = vfmadd231ps_fma(auVar88,auVar87,auVar69);
    auVar42 = vfmadd231ps_fma(auVar83,auVar87,auVar70);
    auVar85._28_4_ = auVar70._28_4_;
    auVar85._0_28_ =
         ZEXT1628(CONCAT412(fVar236 * auVar42._12_4_,
                            CONCAT48(fVar235 * auVar42._8_4_,
                                     CONCAT44(fVar234 * auVar42._4_4_,fVar233 * auVar42._0_4_))));
    auVar43 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar236 * auVar58._12_4_,
                                                 CONCAT48(fVar235 * auVar58._8_4_,
                                                          CONCAT44(fVar234 * auVar58._4_4_,
                                                                   fVar233 * auVar58._0_4_)))),
                              auVar87,ZEXT1632(auVar56));
    auVar44 = vfmadd231ps_fma(auVar85,auVar87,ZEXT1632(auVar57));
    auVar84 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar56));
    auVar69 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar57));
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar84 = vmulps_avx512vl(auVar84,auVar70);
    auVar69 = vmulps_avx512vl(auVar69,auVar70);
    auVar166._0_4_ = fVar238 * auVar84._0_4_;
    auVar166._4_4_ = fVar238 * auVar84._4_4_;
    auVar166._8_4_ = fVar238 * auVar84._8_4_;
    auVar166._12_4_ = fVar238 * auVar84._12_4_;
    auVar166._16_4_ = fVar238 * auVar84._16_4_;
    auVar166._20_4_ = fVar238 * auVar84._20_4_;
    auVar166._24_4_ = fVar238 * auVar84._24_4_;
    auVar166._28_4_ = 0;
    auVar84 = vmulps_avx512vl(auVar220,auVar69);
    auVar57 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
    auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_01feed00,ZEXT1632(auVar57));
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar44),_DAT_01feed00,ZEXT1632(auVar57));
    auVar124._0_4_ = auVar166._0_4_ + auVar43._0_4_;
    auVar124._4_4_ = auVar166._4_4_ + auVar43._4_4_;
    auVar124._8_4_ = auVar166._8_4_ + auVar43._8_4_;
    auVar124._12_4_ = auVar166._12_4_ + auVar43._12_4_;
    auVar124._16_4_ = auVar166._16_4_ + 0.0;
    auVar124._20_4_ = auVar166._20_4_ + 0.0;
    auVar124._24_4_ = auVar166._24_4_ + 0.0;
    auVar124._28_4_ = 0;
    auVar88 = ZEXT1632(auVar57);
    auVar72 = vpermt2ps_avx512vl(auVar166,_DAT_01feed00,auVar88);
    auVar73 = vaddps_avx512vl(ZEXT1632(auVar44),auVar84);
    auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar88);
    auVar84 = vsubps_avx(auVar69,auVar72);
    auVar72 = vsubps_avx512vl(auVar71,auVar74);
    auVar74 = vmulps_avx512vl(auVar78,auVar89);
    auVar76 = vmulps_avx512vl(auVar79,auVar89);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar87,auVar75);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar77);
    auVar83 = vmulps_avx512vl(auVar86,auVar89);
    auVar85 = vmulps_avx512vl(auVar80,auVar89);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar78);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar79);
    auVar75 = vmulps_avx512vl(auVar81,auVar89);
    auVar77 = vmulps_avx512vl(auVar82,auVar89);
    auVar56 = vfmadd231ps_fma(auVar75,auVar87,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar80);
    auVar75 = vmulps_avx512vl(auVar89,auVar83);
    auVar78 = ZEXT1632(auVar54);
    auVar77 = vmulps_avx512vl(auVar78,auVar85);
    auVar74 = vfmadd231ps_avx512vl(auVar75,auVar87,auVar74);
    auVar76 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar76);
    auVar86 = vmulps_avx512vl(auVar78,auVar86);
    auVar83 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar236 * auVar56._12_4_,
                                            CONCAT48(fVar235 * auVar56._8_4_,
                                                     CONCAT44(fVar234 * auVar56._4_4_,
                                                              fVar233 * auVar56._0_4_)))),auVar87,
                         auVar83);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar87,auVar85);
    auVar75._4_4_ = fVar234 * auVar83._4_4_;
    auVar75._0_4_ = fVar233 * auVar83._0_4_;
    auVar75._8_4_ = fVar235 * auVar83._8_4_;
    auVar75._12_4_ = fVar236 * auVar83._12_4_;
    auVar75._16_4_ = auVar83._16_4_ * 0.0;
    auVar75._20_4_ = auVar83._20_4_ * 0.0;
    auVar75._24_4_ = auVar83._24_4_ * 0.0;
    auVar75._28_4_ = auVar80._28_4_;
    auVar85 = vmulps_avx512vl(auVar78,auVar86);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar87,auVar74);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar76,auVar87);
    auVar87 = vsubps_avx512vl(auVar83,auVar74);
    auVar86 = vsubps_avx512vl(auVar86,auVar76);
    auVar87 = vmulps_avx512vl(auVar87,auVar70);
    auVar86 = vmulps_avx512vl(auVar86,auVar70);
    fVar222 = fVar238 * auVar87._0_4_;
    fVar233 = fVar238 * auVar87._4_4_;
    auVar77._4_4_ = fVar233;
    auVar77._0_4_ = fVar222;
    fVar234 = fVar238 * auVar87._8_4_;
    auVar77._8_4_ = fVar234;
    fVar235 = fVar238 * auVar87._12_4_;
    auVar77._12_4_ = fVar235;
    fVar236 = fVar238 * auVar87._16_4_;
    auVar77._16_4_ = fVar236;
    fVar237 = fVar238 * auVar87._20_4_;
    auVar77._20_4_ = fVar237;
    fVar238 = fVar238 * auVar87._24_4_;
    auVar77._24_4_ = fVar238;
    auVar77._28_4_ = auVar87._28_4_;
    auVar86 = vmulps_avx512vl(auVar220,auVar86);
    auVar70 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar88);
    auVar74 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar88);
    auVar221._0_4_ = auVar75._0_4_ + fVar222;
    auVar221._4_4_ = auVar75._4_4_ + fVar233;
    auVar221._8_4_ = auVar75._8_4_ + fVar234;
    auVar221._12_4_ = auVar75._12_4_ + fVar235;
    auVar221._16_4_ = auVar75._16_4_ + fVar236;
    auVar221._20_4_ = auVar75._20_4_ + fVar237;
    auVar221._24_4_ = auVar75._24_4_ + fVar238;
    auVar221._28_4_ = auVar75._28_4_ + auVar87._28_4_;
    auVar87 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,ZEXT1632(auVar57));
    auVar76 = vaddps_avx512vl(auVar85,auVar86);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,ZEXT1632(auVar57));
    auVar87 = vsubps_avx(auVar70,auVar87);
    auVar86 = vsubps_avx512vl(auVar74,auVar86);
    in_ZMM17 = ZEXT3264(auVar86);
    auVar146 = ZEXT1632(auVar43);
    auVar83 = vsubps_avx512vl(auVar75,auVar146);
    auVar166 = ZEXT1632(auVar44);
    auVar77 = vsubps_avx512vl(auVar85,auVar166);
    auVar78 = vsubps_avx512vl(auVar70,auVar69);
    auVar83 = vaddps_avx512vl(auVar83,auVar78);
    auVar78 = vsubps_avx512vl(auVar74,auVar71);
    auVar77 = vaddps_avx512vl(auVar77,auVar78);
    auVar78 = vmulps_avx512vl(auVar166,auVar83);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar146,auVar77);
    auVar79 = vmulps_avx512vl(auVar73,auVar83);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar124,auVar77);
    auVar80 = vmulps_avx512vl(auVar72,auVar83);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar84,auVar77);
    auVar81 = vmulps_avx512vl(auVar71,auVar83);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar69,auVar77);
    auVar82 = vmulps_avx512vl(auVar85,auVar83);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar75,auVar77);
    auVar88 = vmulps_avx512vl(auVar76,auVar83);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar221,auVar77);
    auVar89 = vmulps_avx512vl(auVar86,auVar83);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar87,auVar77);
    auVar83 = vmulps_avx512vl(auVar74,auVar83);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar70,auVar77);
    auVar77 = vminps_avx512vl(auVar78,auVar79);
    auVar78 = vmaxps_avx512vl(auVar78,auVar79);
    auVar79 = vminps_avx512vl(auVar80,auVar81);
    auVar77 = vminps_avx512vl(auVar77,auVar79);
    auVar79 = vmaxps_avx512vl(auVar80,auVar81);
    auVar78 = vmaxps_avx512vl(auVar78,auVar79);
    auVar79 = vminps_avx512vl(auVar82,auVar88);
    auVar80 = vmaxps_avx512vl(auVar82,auVar88);
    auVar81 = vminps_avx512vl(auVar89,auVar83);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar77 = vminps_avx512vl(auVar77,auVar79);
    auVar83 = vmaxps_avx512vl(auVar89,auVar83);
    auVar83 = vmaxps_avx512vl(auVar80,auVar83);
    auVar83 = vmaxps_avx512vl(auVar78,auVar83);
    uVar18 = vcmpps_avx512vl(auVar77,local_260,2);
    auVar78._4_4_ = uStack_1bc;
    auVar78._0_4_ = local_1c0;
    auVar78._8_4_ = uStack_1b8;
    auVar78._12_4_ = uStack_1b4;
    auVar78._16_4_ = uStack_1b0;
    auVar78._20_4_ = uStack_1ac;
    auVar78._24_4_ = uStack_1a8;
    auVar78._28_4_ = uStack_1a4;
    uVar19 = vcmpps_avx512vl(auVar83,auVar78,5);
    bVar25 = (byte)uVar18 & (byte)uVar19 & 0x7f;
    if (bVar25 == 0) {
      auVar56 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    else {
      auVar83 = vsubps_avx512vl(auVar69,auVar146);
      auVar77 = vsubps_avx512vl(auVar71,auVar166);
      auVar79 = vsubps_avx512vl(auVar70,auVar75);
      auVar83 = vaddps_avx512vl(auVar83,auVar79);
      auVar79 = vsubps_avx512vl(auVar74,auVar85);
      auVar77 = vaddps_avx512vl(auVar77,auVar79);
      auVar79 = vmulps_avx512vl(auVar166,auVar83);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar77,auVar146);
      auVar73 = vmulps_avx512vl(auVar73,auVar83);
      auVar73 = vfnmadd213ps_avx512vl(auVar124,auVar77,auVar73);
      auVar72 = vmulps_avx512vl(auVar72,auVar83);
      auVar72 = vfnmadd213ps_avx512vl(auVar84,auVar77,auVar72);
      auVar84 = vmulps_avx512vl(auVar71,auVar83);
      auVar71 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar69);
      auVar84 = vmulps_avx512vl(auVar85,auVar83);
      auVar85 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar75);
      auVar84 = vmulps_avx512vl(auVar76,auVar83);
      auVar76 = vfnmadd213ps_avx512vl(auVar221,auVar77,auVar84);
      auVar84 = vmulps_avx512vl(auVar86,auVar83);
      auVar75 = vfnmadd213ps_avx512vl(auVar87,auVar77,auVar84);
      auVar87 = vmulps_avx512vl(auVar74,auVar83);
      auVar74 = vfnmadd231ps_avx512vl(auVar87,auVar70,auVar77);
      auVar84 = vminps_avx(auVar79,auVar73);
      auVar87 = vmaxps_avx(auVar79,auVar73);
      auVar69 = vminps_avx(auVar72,auVar71);
      auVar69 = vminps_avx(auVar84,auVar69);
      auVar84 = vmaxps_avx(auVar72,auVar71);
      auVar87 = vmaxps_avx(auVar87,auVar84);
      auVar86 = vminps_avx(auVar85,auVar76);
      auVar84 = vmaxps_avx(auVar85,auVar76);
      auVar70 = vminps_avx(auVar75,auVar74);
      auVar86 = vminps_avx(auVar86,auVar70);
      auVar86 = vminps_avx(auVar69,auVar86);
      auVar69 = vmaxps_avx(auVar75,auVar74);
      auVar84 = vmaxps_avx(auVar84,auVar69);
      auVar87 = vmaxps_avx(auVar87,auVar84);
      uVar18 = vcmpps_avx512vl(auVar87,auVar78,5);
      uVar19 = vcmpps_avx512vl(auVar86,local_260,2);
      bVar25 = bVar25 & (byte)uVar18 & (byte)uVar19;
      if (bVar25 != 0) {
        auStack_440[uVar27] = (uint)bVar25;
        uVar18 = vmovlps_avx(auVar40);
        (&uStack_240)[uVar27] = uVar18;
        uVar3 = vmovlps_avx(auVar116);
        auStack_1a0[uVar27] = uVar3;
        uVar27 = (ulong)((int)uVar27 + 1);
      }
      auVar56 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    auVar274 = ZEXT1664(auVar54);
    auVar273 = ZEXT3264(_DAT_01feed20);
    in_ZMM21 = ZEXT464(0x3e2aaaab);
    auVar272 = ZEXT1664(auVar40);
    auVar271 = ZEXT3264(auVar87);
    auVar270 = ZEXT1664(auVar56);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar277 = ZEXT1664(auVar40);
LAB_01b932c1:
    do {
      do {
        do {
          auVar54 = auVar270._0_16_;
          auVar56 = auVar274._0_16_;
          if ((int)uVar27 == 0) {
            if (bVar33 != false) {
              return bVar33;
            }
            uVar103 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar24._4_4_ = uVar103;
            auVar24._0_4_ = uVar103;
            auVar24._8_4_ = uVar103;
            auVar24._12_4_ = uVar103;
            uVar18 = vcmpps_avx512vl(local_3a0,auVar24,2);
            uVar34 = (uint)uVar39 & (uint)uVar39 + 0xf & (uint)uVar18;
            uVar39 = (ulong)uVar34;
            if (uVar34 == 0) {
              return false;
            }
            goto LAB_01b9225c;
          }
          uVar26 = (int)uVar27 - 1;
          uVar28 = (ulong)uVar26;
          uVar7 = auStack_440[uVar28];
          auVar116._8_8_ = 0;
          auVar116._0_8_ = auStack_1a0[uVar28];
          uVar3 = 0;
          for (uVar32 = (ulong)uVar7; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar30 = uVar7 - 1 & uVar7;
          bVar37 = uVar30 == 0;
          auStack_440[uVar28] = uVar30;
          if (bVar37) {
            uVar27 = (ulong)uVar26;
          }
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar3;
          auVar40 = vpunpcklqdq_avx(auVar106,ZEXT416((int)uVar3 + 1));
          auVar40 = vcvtqq2ps_avx512vl(auVar40);
          auVar40 = vmulps_avx512vl(auVar40,auVar272._0_16_);
          uVar103 = *(undefined4 *)((long)&uStack_240 + uVar28 * 8 + 4);
          auVar21._4_4_ = uVar103;
          auVar21._0_4_ = uVar103;
          auVar21._8_4_ = uVar103;
          auVar21._12_4_ = uVar103;
          auVar57 = vmulps_avx512vl(auVar40,auVar21);
          auVar132._8_4_ = 0x3f800000;
          auVar132._0_8_ = 0x3f8000003f800000;
          auVar132._12_4_ = 0x3f800000;
          auVar40 = vsubps_avx(auVar132,auVar40);
          uVar103 = *(undefined4 *)(&uStack_240 + uVar28);
          auVar22._4_4_ = uVar103;
          auVar22._0_4_ = uVar103;
          auVar22._8_4_ = uVar103;
          auVar22._12_4_ = uVar103;
          auVar40 = vfmadd231ps_avx512vl(auVar57,auVar40,auVar22);
          auVar57 = vmovshdup_avx(auVar40);
          fVar238 = auVar57._0_4_ - auVar40._0_4_;
          auVar57 = vucomiss_avx512f(ZEXT416((uint)fVar238));
          in_ZMM21 = ZEXT1664(auVar57);
          if (uVar7 == 0 || bVar37) goto LAB_01b92d59;
          auVar57 = vshufps_avx(auVar116,auVar116,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar238));
          auVar143._8_4_ = 0x3f800000;
          auVar143._0_8_ = 0x3f8000003f800000;
          auVar143._12_4_ = 0x3f800000;
          auVar58 = vsubps_avx(auVar143,auVar57);
          fVar222 = auVar57._0_4_;
          auVar161._0_4_ = fVar222 * fVar140;
          fVar233 = auVar57._4_4_;
          auVar161._4_4_ = fVar233 * fVar125;
          fVar234 = auVar57._8_4_;
          auVar161._8_4_ = fVar234 * fVar140;
          fVar235 = auVar57._12_4_;
          auVar161._12_4_ = fVar235 * fVar125;
          auVar178._0_4_ = fVar222 * fVar137;
          auVar178._4_4_ = fVar233 * fVar138;
          auVar178._8_4_ = fVar234 * fVar137;
          auVar178._12_4_ = fVar235 * fVar138;
          auVar186._0_4_ = fVar222 * fVar139;
          auVar186._4_4_ = fVar233 * fVar232;
          auVar186._8_4_ = fVar234 * fVar139;
          auVar186._12_4_ = fVar235 * fVar232;
          auVar133._0_4_ = fVar222 * fVar239;
          auVar133._4_4_ = fVar233 * fVar249;
          auVar133._8_4_ = fVar234 * fVar239;
          auVar133._12_4_ = fVar235 * fVar249;
          auVar57 = vfmadd231ps_fma(auVar161,auVar58,auVar41);
          auVar42 = vfmadd231ps_fma(auVar178,auVar58,auVar52);
          auVar43 = vfmadd231ps_fma(auVar186,auVar58,auVar198);
          auVar58 = vfmadd231ps_fma(auVar133,auVar58,auVar208);
          auVar147._16_16_ = auVar57;
          auVar147._0_16_ = auVar57;
          auVar167._16_16_ = auVar42;
          auVar167._0_16_ = auVar42;
          auVar182._16_16_ = auVar43;
          auVar182._0_16_ = auVar43;
          auVar84 = vpermps_avx512vl(auVar273._0_32_,ZEXT1632(auVar40));
          auVar87 = vsubps_avx(auVar167,auVar147);
          auVar42 = vfmadd213ps_fma(auVar87,auVar84,auVar147);
          auVar87 = vsubps_avx(auVar182,auVar167);
          auVar44 = vfmadd213ps_fma(auVar87,auVar84,auVar167);
          auVar57 = vsubps_avx(auVar58,auVar43);
          auVar168._16_16_ = auVar57;
          auVar168._0_16_ = auVar57;
          auVar57 = vfmadd213ps_fma(auVar168,auVar84,auVar182);
          auVar87 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar42));
          auVar58 = vfmadd213ps_fma(auVar87,auVar84,ZEXT1632(auVar42));
          auVar87 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar44));
          auVar57 = vfmadd213ps_fma(auVar87,auVar84,ZEXT1632(auVar44));
          auVar87 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar58));
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar87,auVar84);
          auVar87 = vmulps_avx512vl(auVar87,auVar271._0_32_);
          auVar80._16_16_ = auVar87._16_16_;
          auVar57 = vmulss_avx512f(ZEXT416((uint)fVar238),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar222 = auVar57._0_4_;
          auVar187._0_8_ =
               CONCAT44(auVar68._4_4_ + fVar222 * auVar87._4_4_,
                        auVar68._0_4_ + fVar222 * auVar87._0_4_);
          auVar187._8_4_ = auVar68._8_4_ + fVar222 * auVar87._8_4_;
          auVar187._12_4_ = auVar68._12_4_ + fVar222 * auVar87._12_4_;
          auVar162._0_4_ = fVar222 * auVar87._16_4_;
          auVar162._4_4_ = fVar222 * auVar87._20_4_;
          auVar162._8_4_ = fVar222 * auVar87._24_4_;
          auVar162._12_4_ = fVar222 * auVar87._28_4_;
          auVar50 = vsubps_avx((undefined1  [16])0x0,auVar162);
          auVar44 = vshufpd_avx(auVar68,auVar68,3);
          auVar45 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar57 = vsubps_avx(auVar44,auVar68);
          auVar58 = vsubps_avx(auVar45,(undefined1  [16])0x0);
          auVar209._0_4_ = auVar57._0_4_ + auVar58._0_4_;
          auVar209._4_4_ = auVar57._4_4_ + auVar58._4_4_;
          auVar209._8_4_ = auVar57._8_4_ + auVar58._8_4_;
          auVar209._12_4_ = auVar57._12_4_ + auVar58._12_4_;
          auVar57 = vshufps_avx(auVar68,auVar68,0xb1);
          auVar58 = vshufps_avx(auVar187,auVar187,0xb1);
          auVar42 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar43 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar258._4_4_ = auVar209._0_4_;
          auVar258._0_4_ = auVar209._0_4_;
          auVar258._8_4_ = auVar209._0_4_;
          auVar258._12_4_ = auVar209._0_4_;
          auVar46 = vshufps_avx(auVar209,auVar209,0x55);
          fVar222 = auVar46._0_4_;
          auVar218._0_4_ = auVar57._0_4_ * fVar222;
          fVar233 = auVar46._4_4_;
          auVar218._4_4_ = auVar57._4_4_ * fVar233;
          fVar234 = auVar46._8_4_;
          auVar218._8_4_ = auVar57._8_4_ * fVar234;
          fVar235 = auVar46._12_4_;
          auVar218._12_4_ = auVar57._12_4_ * fVar235;
          auVar224._0_4_ = auVar58._0_4_ * fVar222;
          auVar224._4_4_ = auVar58._4_4_ * fVar233;
          auVar224._8_4_ = auVar58._8_4_ * fVar234;
          auVar224._12_4_ = auVar58._12_4_ * fVar235;
          auVar243._0_4_ = auVar42._0_4_ * fVar222;
          auVar243._4_4_ = auVar42._4_4_ * fVar233;
          auVar243._8_4_ = auVar42._8_4_ * fVar234;
          auVar243._12_4_ = auVar42._12_4_ * fVar235;
          auVar210._0_4_ = auVar43._0_4_ * fVar222;
          auVar210._4_4_ = auVar43._4_4_ * fVar233;
          auVar210._8_4_ = auVar43._8_4_ * fVar234;
          auVar210._12_4_ = auVar43._12_4_ * fVar235;
          auVar57 = vfmadd231ps_fma(auVar218,auVar258,auVar68);
          auVar58 = vfmadd231ps_fma(auVar224,auVar258,auVar187);
          auVar51 = vfmadd231ps_fma(auVar243,auVar258,auVar50);
          auVar64 = vfmadd231ps_fma(auVar210,(undefined1  [16])0x0,auVar258);
          auVar46 = vshufpd_avx(auVar57,auVar57,1);
          auVar47 = vshufpd_avx(auVar58,auVar58,1);
          auVar62 = vshufpd_avx512vl(auVar51,auVar51,1);
          auVar63 = vshufpd_avx512vl(auVar64,auVar64,1);
          in_ZMM17 = ZEXT1664(auVar63);
          auVar42 = vminss_avx(auVar57,auVar58);
          auVar57 = vmaxss_avx(auVar58,auVar57);
          auVar43 = vminss_avx(auVar51,auVar64);
          auVar58 = vmaxss_avx(auVar64,auVar51);
          auVar42 = vminss_avx(auVar42,auVar43);
          auVar57 = vmaxss_avx(auVar58,auVar57);
          auVar43 = vminss_avx(auVar46,auVar47);
          auVar58 = vmaxss_avx(auVar47,auVar46);
          auVar46 = vminss_avx512f(auVar62,auVar63);
          auVar47 = vmaxss_avx512f(auVar63,auVar62);
          auVar58 = vmaxss_avx(auVar47,auVar58);
          auVar43 = vminss_avx512f(auVar43,auVar46);
          vucomiss_avx512f(auVar42);
          fVar233 = auVar58._0_4_;
          fVar222 = auVar57._0_4_;
          if (4 < (uint)uVar27) {
            bVar38 = fVar233 == -0.0001;
            bVar35 = NAN(fVar233);
            if (fVar233 <= -0.0001) goto LAB_01b934f8;
            break;
          }
LAB_01b934f8:
          auVar46 = vucomiss_avx512f(auVar43);
          bVar38 = fVar233 <= -0.0001;
          bVar36 = -0.0001 < fVar222;
          bVar35 = bVar38;
          if (!bVar38) break;
          uVar18 = vcmpps_avx512vl(auVar42,auVar46,5);
          uVar19 = vcmpps_avx512vl(auVar43,auVar46,5);
          bVar25 = (byte)uVar18 & (byte)uVar19 & 1;
          bVar38 = bVar36 && bVar25 == 0;
          bVar35 = bVar36 && bVar25 == 0;
        } while (!bVar36 || bVar25 != 0);
        vcmpss_avx512f(auVar42,auVar54,1);
        auVar51 = auVar276._0_16_;
        uVar18 = vcmpss_avx512f(auVar57,auVar54,1);
        bVar36 = (bool)((byte)uVar18 & 1);
        auVar80._0_16_ = auVar51;
        iVar101 = auVar276._0_4_;
        auVar90._4_28_ = auVar80._4_28_;
        auVar90._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar101);
        vucomiss_avx512f(auVar90._0_16_);
        bVar35 = (bool)(!bVar38 | bVar35);
        bVar36 = bVar35 == false;
        auVar92._16_16_ = auVar80._16_16_;
        auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar35 * auVar270._0_4_ + (uint)!bVar35 * 0x7f800000;
        auVar47 = auVar91._0_16_;
        auVar94._16_16_ = auVar80._16_16_;
        auVar94._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar35 * auVar270._0_4_ + (uint)!bVar35 * -0x800000;
        auVar46 = auVar93._0_16_;
        uVar18 = vcmpss_avx512f(auVar43,auVar54,1);
        bVar38 = (bool)((byte)uVar18 & 1);
        auVar96._16_16_ = auVar80._16_16_;
        auVar96._0_16_ = auVar51;
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * iVar101);
        auVar43 = vucomiss_avx512f(auVar95._0_16_);
        in_ZMM17 = ZEXT1664(auVar43);
        if ((bVar35) || (bVar36)) {
          auVar43 = vucomiss_avx512f(auVar42);
          if ((bVar35) || (bVar36)) {
            auVar64 = vxorps_avx512vl(auVar42,auVar277._0_16_);
            in_ZMM17 = ZEXT1664(auVar64);
            auVar42 = vsubss_avx512f(auVar43,auVar42);
            auVar42 = vdivss_avx512f(auVar64,auVar42);
            auVar43 = vsubss_avx512f(auVar51,auVar42);
            auVar42 = vfmadd213ss_avx512f(auVar43,auVar54,auVar42);
            auVar43 = auVar42;
          }
          else {
            auVar43 = vxorps_avx512vl(auVar43,auVar43);
            vucomiss_avx512f(auVar43);
            if ((bVar35) || (auVar42 = auVar51, bVar36)) {
              auVar42 = SUB6416(ZEXT464(0xff800000),0);
              auVar43 = ZEXT416(0x7f800000);
            }
          }
          auVar47 = vminss_avx512f(auVar47,auVar43);
          auVar46 = vmaxss_avx(auVar42,auVar46);
        }
        uVar18 = vcmpss_avx512f(auVar58,auVar54,1);
        bVar38 = (bool)((byte)uVar18 & 1);
        fVar234 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * iVar101);
        if ((auVar90._0_4_ != fVar234) || (NAN(auVar90._0_4_) || NAN(fVar234))) {
          if ((fVar233 != fVar222) || (NAN(fVar233) || NAN(fVar222))) {
            auVar57 = vxorps_avx512vl(auVar57,auVar277._0_16_);
            auVar211._0_4_ = auVar57._0_4_ / (fVar233 - fVar222);
            auVar211._4_12_ = auVar57._4_12_;
            auVar57 = vsubss_avx512f(auVar51,auVar211);
            auVar57 = vfmadd213ss_avx512f(auVar57,auVar54,auVar211);
            auVar58 = auVar57;
          }
          else if ((fVar222 != 0.0) ||
                  (auVar57 = auVar51, auVar58 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar222))) {
            auVar57 = SUB6416(ZEXT464(0xff800000),0);
            auVar58 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar47 = vminss_avx(auVar47,auVar58);
          auVar46 = vmaxss_avx(auVar57,auVar46);
        }
        bVar38 = auVar95._0_4_ != fVar234;
        auVar57 = vminss_avx512f(auVar47,auVar51);
        auVar98._16_16_ = auVar80._16_16_;
        auVar98._0_16_ = auVar47;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar38 * auVar57._0_4_ + (uint)!bVar38 * auVar47._0_4_;
        auVar57 = vmaxss_avx512f(auVar51,auVar46);
        auVar100._16_16_ = auVar80._16_16_;
        auVar100._0_16_ = auVar46;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar38 * auVar57._0_4_ + (uint)!bVar38 * auVar46._0_4_;
        auVar57 = vmaxss_avx512f(auVar54,auVar97._0_16_);
        auVar58 = vminss_avx512f(auVar99._0_16_,auVar51);
      } while (auVar58._0_4_ < auVar57._0_4_);
      auVar64 = vmaxss_avx512f(auVar54,ZEXT416((uint)(auVar57._0_4_ + -0.1)));
      auVar63 = vminss_avx512f(ZEXT416((uint)(auVar58._0_4_ + 0.1)),auVar51);
      auVar134._0_8_ = auVar68._0_8_;
      auVar134._8_8_ = auVar134._0_8_;
      auVar225._8_8_ = auVar187._0_8_;
      auVar225._0_8_ = auVar187._0_8_;
      auVar244._8_8_ = auVar50._0_8_;
      auVar244._0_8_ = auVar50._0_8_;
      auVar57 = vshufpd_avx(auVar187,auVar187,3);
      auVar58 = vshufpd_avx(auVar50,auVar50,3);
      auVar42 = vshufps_avx(auVar64,auVar63,0);
      auVar259._8_4_ = 0x3f800000;
      auVar259._0_8_ = 0x3f8000003f800000;
      auVar259._12_4_ = 0x3f800000;
      auVar43 = vsubps_avx(auVar259,auVar42);
      fVar222 = auVar42._0_4_;
      auVar179._0_4_ = fVar222 * auVar44._0_4_;
      fVar233 = auVar42._4_4_;
      auVar179._4_4_ = fVar233 * auVar44._4_4_;
      fVar234 = auVar42._8_4_;
      auVar179._8_4_ = fVar234 * auVar44._8_4_;
      fVar235 = auVar42._12_4_;
      auVar179._12_4_ = fVar235 * auVar44._12_4_;
      auVar188._0_4_ = fVar222 * auVar57._0_4_;
      auVar188._4_4_ = fVar233 * auVar57._4_4_;
      auVar188._8_4_ = fVar234 * auVar57._8_4_;
      auVar188._12_4_ = fVar235 * auVar57._12_4_;
      auVar265._0_4_ = auVar58._0_4_ * fVar222;
      auVar265._4_4_ = auVar58._4_4_ * fVar233;
      auVar265._8_4_ = auVar58._8_4_ * fVar234;
      auVar265._12_4_ = auVar58._12_4_ * fVar235;
      auVar163._0_4_ = fVar222 * auVar45._0_4_;
      auVar163._4_4_ = fVar233 * auVar45._4_4_;
      auVar163._8_4_ = fVar234 * auVar45._8_4_;
      auVar163._12_4_ = fVar235 * auVar45._12_4_;
      auVar44 = vfmadd231ps_fma(auVar179,auVar43,auVar134);
      auVar45 = vfmadd231ps_fma(auVar188,auVar43,auVar225);
      auVar46 = vfmadd231ps_fma(auVar265,auVar43,auVar244);
      auVar47 = vfmadd231ps_fma(auVar163,auVar43,ZEXT816(0));
      auVar58 = vsubss_avx512f(auVar51,auVar64);
      auVar57 = vmovshdup_avx(auVar116);
      auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar64._0_4_)),auVar116,auVar58);
      auVar58 = vsubss_avx512f(auVar51,auVar63);
      auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar63._0_4_)),auVar116,auVar58);
      auVar50 = vdivss_avx512f(auVar51,ZEXT416((uint)fVar238));
      auVar57 = vsubps_avx(auVar45,auVar44);
      auVar42 = vmulps_avx512vl(auVar57,auVar56);
      auVar57 = vsubps_avx(auVar46,auVar45);
      auVar43 = vmulps_avx512vl(auVar57,auVar56);
      auVar57 = vsubps_avx(auVar47,auVar46);
      auVar57 = vmulps_avx512vl(auVar57,auVar56);
      auVar58 = vminps_avx(auVar43,auVar57);
      auVar57 = vmaxps_avx(auVar43,auVar57);
      auVar58 = vminps_avx(auVar42,auVar58);
      auVar57 = vmaxps_avx(auVar42,auVar57);
      auVar42 = vshufpd_avx(auVar58,auVar58,3);
      auVar43 = vshufpd_avx(auVar57,auVar57,3);
      auVar58 = vminps_avx(auVar58,auVar42);
      auVar57 = vmaxps_avx(auVar57,auVar43);
      fVar238 = auVar50._0_4_;
      auVar212._0_4_ = auVar58._0_4_ * fVar238;
      auVar212._4_4_ = auVar58._4_4_ * fVar238;
      auVar212._8_4_ = auVar58._8_4_ * fVar238;
      auVar212._12_4_ = auVar58._12_4_ * fVar238;
      auVar199._0_4_ = fVar238 * auVar57._0_4_;
      auVar199._4_4_ = fVar238 * auVar57._4_4_;
      auVar199._8_4_ = fVar238 * auVar57._8_4_;
      auVar199._12_4_ = fVar238 * auVar57._12_4_;
      auVar50 = vdivss_avx512f(auVar51,ZEXT416((uint)(auVar63._0_4_ - auVar62._0_4_)));
      auVar57 = vshufpd_avx(auVar44,auVar44,3);
      auVar58 = vshufpd_avx(auVar45,auVar45,3);
      auVar42 = vshufpd_avx(auVar46,auVar46,3);
      auVar43 = vshufpd_avx(auVar47,auVar47,3);
      auVar57 = vsubps_avx(auVar57,auVar44);
      auVar44 = vsubps_avx(auVar58,auVar45);
      auVar45 = vsubps_avx(auVar42,auVar46);
      auVar43 = vsubps_avx(auVar43,auVar47);
      auVar58 = vminps_avx(auVar57,auVar44);
      auVar57 = vmaxps_avx(auVar57,auVar44);
      auVar42 = vminps_avx(auVar45,auVar43);
      auVar42 = vminps_avx(auVar58,auVar42);
      auVar58 = vmaxps_avx(auVar45,auVar43);
      auVar57 = vmaxps_avx(auVar57,auVar58);
      fVar238 = auVar50._0_4_;
      auVar245._0_4_ = fVar238 * auVar42._0_4_;
      auVar245._4_4_ = fVar238 * auVar42._4_4_;
      auVar245._8_4_ = fVar238 * auVar42._8_4_;
      auVar245._12_4_ = fVar238 * auVar42._12_4_;
      auVar226._0_4_ = fVar238 * auVar57._0_4_;
      auVar226._4_4_ = fVar238 * auVar57._4_4_;
      auVar226._8_4_ = fVar238 * auVar57._8_4_;
      auVar226._12_4_ = fVar238 * auVar57._12_4_;
      auVar43 = vinsertps_avx(auVar40,auVar62,0x10);
      auVar65 = vpermt2ps_avx512vl(auVar40,_DAT_01feecd0,auVar63);
      auVar117._0_4_ = auVar43._0_4_ + auVar65._0_4_;
      auVar117._4_4_ = auVar43._4_4_ + auVar65._4_4_;
      auVar117._8_4_ = auVar43._8_4_ + auVar65._8_4_;
      auVar117._12_4_ = auVar43._12_4_ + auVar65._12_4_;
      auVar23._8_4_ = 0x3f000000;
      auVar23._0_8_ = 0x3f0000003f000000;
      auVar23._12_4_ = 0x3f000000;
      auVar50 = vmulps_avx512vl(auVar117,auVar23);
      auVar58 = vshufps_avx(auVar50,auVar50,0x54);
      uVar103 = auVar50._0_4_;
      auVar120._4_4_ = uVar103;
      auVar120._0_4_ = uVar103;
      auVar120._8_4_ = uVar103;
      auVar120._12_4_ = uVar103;
      auVar45 = vfmadd213ps_avx512vl(local_270,auVar120,auVar53);
      auVar42 = vfmadd213ps_fma(local_280,auVar120,auVar49);
      auVar44 = vfmadd213ps_fma(local_290,auVar120,auVar48);
      auVar57 = vsubps_avx(auVar42,auVar45);
      auVar45 = vfmadd213ps_fma(auVar57,auVar120,auVar45);
      auVar57 = vsubps_avx(auVar44,auVar42);
      auVar57 = vfmadd213ps_fma(auVar57,auVar120,auVar42);
      auVar57 = vsubps_avx(auVar57,auVar45);
      auVar42 = vfmadd231ps_fma(auVar45,auVar57,auVar120);
      auVar46 = vmulps_avx512vl(auVar57,auVar56);
      auVar251._8_8_ = auVar42._0_8_;
      auVar251._0_8_ = auVar42._0_8_;
      auVar57 = vshufpd_avx(auVar42,auVar42,3);
      auVar42 = vshufps_avx(auVar50,auVar50,0x55);
      auVar44 = vsubps_avx(auVar57,auVar251);
      auVar45 = vfmadd231ps_fma(auVar251,auVar42,auVar44);
      auVar266._8_8_ = auVar46._0_8_;
      auVar266._0_8_ = auVar46._0_8_;
      auVar57 = vshufpd_avx(auVar46,auVar46,3);
      auVar57 = vsubps_avx512vl(auVar57,auVar266);
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar42,auVar266);
      auVar121._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      auVar121._8_4_ = auVar44._8_4_ ^ 0x80000000;
      auVar121._12_4_ = auVar44._12_4_ ^ 0x80000000;
      auVar42 = vmovshdup_avx512vl(auVar57);
      auVar267._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
      auVar267._8_4_ = auVar42._8_4_ ^ 0x80000000;
      auVar267._12_4_ = auVar42._12_4_ ^ 0x80000000;
      auVar46 = vmovshdup_avx512vl(auVar44);
      auVar47 = vpermt2ps_avx512vl(auVar267,ZEXT416(5),auVar44);
      auVar42 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar42._0_4_ * auVar44._0_4_)),auVar57,auVar46);
      auVar44 = vpermt2ps_avx512vl(auVar57,SUB6416(ZEXT464(4),0),auVar121);
      auVar164._0_4_ = auVar42._0_4_;
      auVar164._4_4_ = auVar164._0_4_;
      auVar164._8_4_ = auVar164._0_4_;
      auVar164._12_4_ = auVar164._0_4_;
      auVar57 = vdivps_avx(auVar47,auVar164);
      auVar66 = vdivps_avx512vl(auVar44,auVar164);
      fVar238 = auVar45._0_4_;
      auVar42 = vshufps_avx(auVar45,auVar45,0x55);
      auVar252._0_4_ = fVar238 * auVar57._0_4_ + auVar42._0_4_ * auVar66._0_4_;
      auVar252._4_4_ = fVar238 * auVar57._4_4_ + auVar42._4_4_ * auVar66._4_4_;
      auVar252._8_4_ = fVar238 * auVar57._8_4_ + auVar42._8_4_ * auVar66._8_4_;
      auVar252._12_4_ = fVar238 * auVar57._12_4_ + auVar42._12_4_ * auVar66._12_4_;
      auVar64 = vsubps_avx(auVar58,auVar252);
      auVar42 = vmovshdup_avx(auVar57);
      auVar58 = vinsertps_avx(auVar212,auVar245,0x1c);
      auVar268._0_4_ = auVar42._0_4_ * auVar58._0_4_;
      auVar268._4_4_ = auVar42._4_4_ * auVar58._4_4_;
      auVar268._8_4_ = auVar42._8_4_ * auVar58._8_4_;
      auVar268._12_4_ = auVar42._12_4_ * auVar58._12_4_;
      auVar68 = vinsertps_avx512f(auVar199,auVar226,0x1c);
      auVar42 = vmulps_avx512vl(auVar42,auVar68);
      auVar47 = vminps_avx512vl(auVar268,auVar42);
      auVar45 = vmaxps_avx(auVar42,auVar268);
      auVar46 = vmovshdup_avx(auVar66);
      auVar42 = vinsertps_avx(auVar245,auVar212,0x4c);
      auVar246._0_4_ = auVar46._0_4_ * auVar42._0_4_;
      auVar246._4_4_ = auVar46._4_4_ * auVar42._4_4_;
      auVar246._8_4_ = auVar46._8_4_ * auVar42._8_4_;
      auVar246._12_4_ = auVar46._12_4_ * auVar42._12_4_;
      auVar44 = vinsertps_avx(auVar226,auVar199,0x4c);
      auVar227._0_4_ = auVar46._0_4_ * auVar44._0_4_;
      auVar227._4_4_ = auVar46._4_4_ * auVar44._4_4_;
      auVar227._8_4_ = auVar46._8_4_ * auVar44._8_4_;
      auVar227._12_4_ = auVar46._12_4_ * auVar44._12_4_;
      auVar46 = vminps_avx(auVar246,auVar227);
      auVar47 = vaddps_avx512vl(auVar47,auVar46);
      auVar46 = vmaxps_avx(auVar227,auVar246);
      auVar228._0_4_ = auVar45._0_4_ + auVar46._0_4_;
      auVar228._4_4_ = auVar45._4_4_ + auVar46._4_4_;
      auVar228._8_4_ = auVar45._8_4_ + auVar46._8_4_;
      auVar228._12_4_ = auVar45._12_4_ + auVar46._12_4_;
      auVar247._8_8_ = 0x3f80000000000000;
      auVar247._0_8_ = 0x3f80000000000000;
      auVar45 = vsubps_avx(auVar247,auVar228);
      auVar46 = vsubps_avx(auVar247,auVar47);
      auVar47 = vsubps_avx(auVar43,auVar50);
      auVar50 = vsubps_avx(auVar65,auVar50);
      fVar235 = auVar47._0_4_;
      auVar269._0_4_ = fVar235 * auVar45._0_4_;
      fVar236 = auVar47._4_4_;
      auVar269._4_4_ = fVar236 * auVar45._4_4_;
      fVar237 = auVar47._8_4_;
      auVar269._8_4_ = fVar237 * auVar45._8_4_;
      fVar192 = auVar47._12_4_;
      auVar269._12_4_ = fVar192 * auVar45._12_4_;
      auVar67 = vbroadcastss_avx512vl(auVar57);
      auVar58 = vmulps_avx512vl(auVar67,auVar58);
      auVar68 = vmulps_avx512vl(auVar67,auVar68);
      auVar67 = vminps_avx512vl(auVar58,auVar68);
      auVar68 = vmaxps_avx512vl(auVar68,auVar58);
      auVar58 = vbroadcastss_avx512vl(auVar66);
      auVar42 = vmulps_avx512vl(auVar58,auVar42);
      auVar58 = vmulps_avx512vl(auVar58,auVar44);
      auVar44 = vminps_avx512vl(auVar42,auVar58);
      auVar44 = vaddps_avx512vl(auVar67,auVar44);
      auVar47 = vmulps_avx512vl(auVar47,auVar46);
      in_ZMM17 = ZEXT1664(auVar47);
      fVar238 = auVar50._0_4_;
      auVar229._0_4_ = fVar238 * auVar45._0_4_;
      fVar222 = auVar50._4_4_;
      auVar229._4_4_ = fVar222 * auVar45._4_4_;
      fVar233 = auVar50._8_4_;
      auVar229._8_4_ = fVar233 * auVar45._8_4_;
      fVar234 = auVar50._12_4_;
      auVar229._12_4_ = fVar234 * auVar45._12_4_;
      auVar248._0_4_ = fVar238 * auVar46._0_4_;
      auVar248._4_4_ = fVar222 * auVar46._4_4_;
      auVar248._8_4_ = fVar233 * auVar46._8_4_;
      auVar248._12_4_ = fVar234 * auVar46._12_4_;
      auVar58 = vmaxps_avx(auVar58,auVar42);
      auVar200._0_4_ = auVar68._0_4_ + auVar58._0_4_;
      auVar200._4_4_ = auVar68._4_4_ + auVar58._4_4_;
      auVar200._8_4_ = auVar68._8_4_ + auVar58._8_4_;
      auVar200._12_4_ = auVar68._12_4_ + auVar58._12_4_;
      auVar213._8_8_ = 0x3f800000;
      auVar213._0_8_ = 0x3f800000;
      auVar58 = vsubps_avx(auVar213,auVar200);
      auVar42 = vsubps_avx512vl(auVar213,auVar44);
      auVar260._0_4_ = fVar235 * auVar58._0_4_;
      auVar260._4_4_ = fVar236 * auVar58._4_4_;
      auVar260._8_4_ = fVar237 * auVar58._8_4_;
      auVar260._12_4_ = fVar192 * auVar58._12_4_;
      auVar253._0_4_ = fVar235 * auVar42._0_4_;
      auVar253._4_4_ = fVar236 * auVar42._4_4_;
      auVar253._8_4_ = fVar237 * auVar42._8_4_;
      auVar253._12_4_ = fVar192 * auVar42._12_4_;
      auVar201._0_4_ = fVar238 * auVar58._0_4_;
      auVar201._4_4_ = fVar222 * auVar58._4_4_;
      auVar201._8_4_ = fVar233 * auVar58._8_4_;
      auVar201._12_4_ = fVar234 * auVar58._12_4_;
      auVar214._0_4_ = fVar238 * auVar42._0_4_;
      auVar214._4_4_ = fVar222 * auVar42._4_4_;
      auVar214._8_4_ = fVar233 * auVar42._8_4_;
      auVar214._12_4_ = fVar234 * auVar42._12_4_;
      auVar58 = vminps_avx(auVar260,auVar253);
      auVar42 = vminps_avx512vl(auVar201,auVar214);
      auVar44 = vminps_avx512vl(auVar58,auVar42);
      auVar58 = vmaxps_avx(auVar253,auVar260);
      auVar42 = vmaxps_avx(auVar214,auVar201);
      auVar42 = vmaxps_avx(auVar42,auVar58);
      auVar45 = vminps_avx512vl(auVar269,auVar47);
      auVar58 = vminps_avx(auVar229,auVar248);
      auVar58 = vminps_avx(auVar45,auVar58);
      auVar58 = vhaddps_avx(auVar44,auVar58);
      auVar45 = vmaxps_avx512vl(auVar47,auVar269);
      auVar44 = vmaxps_avx(auVar248,auVar229);
      auVar44 = vmaxps_avx(auVar44,auVar45);
      auVar42 = vhaddps_avx(auVar42,auVar44);
      auVar58 = vshufps_avx(auVar58,auVar58,0xe8);
      auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
      auVar202._0_4_ = auVar58._0_4_ + auVar64._0_4_;
      auVar202._4_4_ = auVar58._4_4_ + auVar64._4_4_;
      auVar202._8_4_ = auVar58._8_4_ + auVar64._8_4_;
      auVar202._12_4_ = auVar58._12_4_ + auVar64._12_4_;
      auVar215._0_4_ = auVar42._0_4_ + auVar64._0_4_;
      auVar215._4_4_ = auVar42._4_4_ + auVar64._4_4_;
      auVar215._8_4_ = auVar42._8_4_ + auVar64._8_4_;
      auVar215._12_4_ = auVar42._12_4_ + auVar64._12_4_;
      auVar58 = vmaxps_avx(auVar43,auVar202);
      auVar42 = vminps_avx(auVar215,auVar65);
      uVar3 = vcmpps_avx512vl(auVar42,auVar58,1);
    } while ((uVar3 & 3) != 0);
    uVar3 = vcmpps_avx512vl(auVar215,auVar65,1);
    uVar18 = vcmpps_avx512vl(auVar40,auVar202,1);
    if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
      bVar25 = 0;
    }
    else {
      auVar58 = vmovshdup_avx(auVar202);
      bVar25 = auVar62._0_4_ < auVar58._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    local_450 = auVar55._0_4_;
    fStack_44c = auVar55._4_4_;
    fStack_448 = auVar55._8_4_;
    fStack_444 = auVar55._12_4_;
    if (((3 < (uint)uVar27 || uVar7 != 0 && !bVar37) | bVar25) == 1) {
      lVar29 = 200;
      do {
        auVar40 = vsubss_avx512f(auVar51,auVar64);
        fVar233 = auVar40._0_4_;
        fVar238 = fVar233 * fVar233 * fVar233;
        fVar234 = auVar64._0_4_;
        fVar222 = fVar234 * 3.0 * fVar233 * fVar233;
        fVar233 = fVar233 * fVar234 * fVar234 * 3.0;
        auVar144._4_4_ = fVar238;
        auVar144._0_4_ = fVar238;
        auVar144._8_4_ = fVar238;
        auVar144._12_4_ = fVar238;
        auVar135._4_4_ = fVar222;
        auVar135._0_4_ = fVar222;
        auVar135._8_4_ = fVar222;
        auVar135._12_4_ = fVar222;
        auVar107._4_4_ = fVar233;
        auVar107._0_4_ = fVar233;
        auVar107._8_4_ = fVar233;
        auVar107._12_4_ = fVar233;
        fVar234 = fVar234 * fVar234 * fVar234;
        auVar180._0_4_ = local_450 * fVar234;
        auVar180._4_4_ = fStack_44c * fVar234;
        auVar180._8_4_ = fStack_448 * fVar234;
        auVar180._12_4_ = fStack_444 * fVar234;
        auVar40 = vfmadd231ps_fma(auVar180,auVar48,auVar107);
        auVar40 = vfmadd231ps_fma(auVar40,auVar49,auVar135);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar53,auVar144);
        auVar108._8_8_ = auVar40._0_8_;
        auVar108._0_8_ = auVar40._0_8_;
        auVar40 = vshufpd_avx(auVar40,auVar40,3);
        auVar58 = vshufps_avx(auVar64,auVar64,0x55);
        auVar40 = vsubps_avx(auVar40,auVar108);
        auVar58 = vfmadd213ps_fma(auVar40,auVar58,auVar108);
        fVar238 = auVar58._0_4_;
        auVar40 = vshufps_avx(auVar58,auVar58,0x55);
        auVar109._0_4_ = auVar57._0_4_ * fVar238 + auVar66._0_4_ * auVar40._0_4_;
        auVar109._4_4_ = auVar57._4_4_ * fVar238 + auVar66._4_4_ * auVar40._4_4_;
        auVar109._8_4_ = auVar57._8_4_ * fVar238 + auVar66._8_4_ * auVar40._8_4_;
        auVar109._12_4_ = auVar57._12_4_ * fVar238 + auVar66._12_4_ * auVar40._12_4_;
        auVar64 = vsubps_avx(auVar64,auVar109);
        auVar40 = vandps_avx512vl(auVar58,auVar275._0_16_);
        auVar58 = vprolq_avx512vl(auVar40,0x20);
        auVar40 = vmaxss_avx(auVar58,auVar40);
        bVar37 = auVar40._0_4_ <= fVar110;
        if (auVar40._0_4_ < fVar110) {
          auVar40 = vucomiss_avx512f(auVar54);
          if (bVar37) {
            auVar57 = vucomiss_avx512f(auVar40);
            auVar276 = ZEXT1664(auVar57);
            if (bVar37) {
              vmovshdup_avx(auVar40);
              auVar57 = vucomiss_avx512f(auVar54);
              if (bVar37) {
                auVar58 = vucomiss_avx512f(auVar57);
                auVar276 = ZEXT1664(auVar58);
                if (bVar37) {
                  auVar42 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar51 = vinsertps_avx(auVar42,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar42 = vdpps_avx(auVar51,local_2a0,0x7f);
                  auVar43 = vdpps_avx(auVar51,local_2b0,0x7f);
                  auVar44 = vdpps_avx(auVar51,local_2c0,0x7f);
                  auVar45 = vdpps_avx(auVar51,local_2d0,0x7f);
                  auVar46 = vdpps_avx(auVar51,local_2e0,0x7f);
                  auVar47 = vdpps_avx(auVar51,local_2f0,0x7f);
                  auVar50 = vdpps_avx(auVar51,local_300,0x7f);
                  auVar51 = vdpps_avx(auVar51,local_310,0x7f);
                  auVar64 = vsubss_avx512f(auVar58,auVar57);
                  fVar238 = auVar57._0_4_;
                  auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * auVar46._0_4_)),auVar64,auVar42
                                           );
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar238)),auVar64,auVar43
                                           );
                  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar238)),auVar64,auVar44
                                           );
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * auVar51._0_4_)),auVar64,auVar45
                                           );
                  auVar58 = vsubss_avx512f(auVar58,auVar40);
                  auVar181._0_4_ = auVar58._0_4_;
                  fVar238 = auVar181._0_4_ * auVar181._0_4_ * auVar181._0_4_;
                  local_120 = auVar40._0_4_;
                  fVar222 = local_120 * 3.0 * auVar181._0_4_ * auVar181._0_4_;
                  fVar233 = auVar181._0_4_ * local_120 * local_120 * 3.0;
                  fVar235 = local_120 * local_120 * local_120;
                  auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * auVar44._0_4_)),
                                            ZEXT416((uint)fVar233),auVar43);
                  auVar58 = vfmadd231ss_fma(auVar58,ZEXT416((uint)fVar222),auVar42);
                  auVar57 = vfmadd231ss_fma(auVar58,ZEXT416((uint)fVar238),auVar57);
                  fVar234 = auVar57._0_4_;
                  if ((fVar102 <= fVar234) &&
                     (fVar236 = *(float *)(ray + k * 4 + 0x100), fVar234 <= fVar236)) {
                    auVar57 = vshufps_avx(auVar40,auVar40,0x55);
                    auVar203._8_4_ = 0x3f800000;
                    auVar203._0_8_ = 0x3f8000003f800000;
                    auVar203._12_4_ = 0x3f800000;
                    auVar58 = vsubps_avx(auVar203,auVar57);
                    fVar237 = auVar57._0_4_;
                    auVar216._0_4_ = fVar237 * (float)local_360._0_4_;
                    fVar192 = auVar57._4_4_;
                    auVar216._4_4_ = fVar192 * (float)local_360._4_4_;
                    fVar193 = auVar57._8_4_;
                    auVar216._8_4_ = fVar193 * fStack_358;
                    fVar194 = auVar57._12_4_;
                    auVar216._12_4_ = fVar194 * fStack_354;
                    auVar219._0_4_ = fVar237 * (float)local_370._0_4_;
                    auVar219._4_4_ = fVar192 * (float)local_370._4_4_;
                    auVar219._8_4_ = fVar193 * fStack_368;
                    auVar219._12_4_ = fVar194 * fStack_364;
                    auVar230._0_4_ = fVar237 * (float)local_380._0_4_;
                    auVar230._4_4_ = fVar192 * (float)local_380._4_4_;
                    auVar230._8_4_ = fVar193 * fStack_378;
                    auVar230._12_4_ = fVar194 * fStack_374;
                    auVar189._0_4_ = fVar237 * (float)local_390._0_4_;
                    auVar189._4_4_ = fVar192 * (float)local_390._4_4_;
                    auVar189._8_4_ = fVar193 * fStack_388;
                    auVar189._12_4_ = fVar194 * fStack_384;
                    auVar57 = vfmadd231ps_fma(auVar216,auVar58,local_320);
                    auVar42 = vfmadd231ps_fma(auVar219,auVar58,local_330);
                    auVar43 = vfmadd231ps_fma(auVar230,auVar58,local_340);
                    auVar44 = vfmadd231ps_fma(auVar189,auVar58,local_350);
                    auVar57 = vsubps_avx(auVar42,auVar57);
                    auVar58 = vsubps_avx(auVar43,auVar42);
                    auVar42 = vsubps_avx(auVar44,auVar43);
                    auVar231._0_4_ = local_120 * auVar58._0_4_;
                    auVar231._4_4_ = local_120 * auVar58._4_4_;
                    auVar231._8_4_ = local_120 * auVar58._8_4_;
                    auVar231._12_4_ = local_120 * auVar58._12_4_;
                    auVar181._4_4_ = auVar181._0_4_;
                    auVar181._8_4_ = auVar181._0_4_;
                    auVar181._12_4_ = auVar181._0_4_;
                    auVar57 = vfmadd231ps_fma(auVar231,auVar181,auVar57);
                    auVar190._0_4_ = local_120 * auVar42._0_4_;
                    auVar190._4_4_ = local_120 * auVar42._4_4_;
                    auVar190._8_4_ = local_120 * auVar42._8_4_;
                    auVar190._12_4_ = local_120 * auVar42._12_4_;
                    auVar58 = vfmadd231ps_fma(auVar190,auVar181,auVar58);
                    auVar191._0_4_ = local_120 * auVar58._0_4_;
                    auVar191._4_4_ = local_120 * auVar58._4_4_;
                    auVar191._8_4_ = local_120 * auVar58._8_4_;
                    auVar191._12_4_ = local_120 * auVar58._12_4_;
                    auVar57 = vfmadd231ps_fma(auVar191,auVar181,auVar57);
                    auVar56 = vmulps_avx512vl(auVar57,auVar56);
                    pGVar8 = (context->scene->geometries).items[uVar34].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01b941ee:
                      bVar25 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar25 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar165._0_4_ = fVar235 * (float)local_3e0._0_4_;
                      auVar165._4_4_ = fVar235 * (float)local_3e0._4_4_;
                      auVar165._8_4_ = fVar235 * fStack_3d8;
                      auVar165._12_4_ = fVar235 * fStack_3d4;
                      auVar145._4_4_ = fVar233;
                      auVar145._0_4_ = fVar233;
                      auVar145._8_4_ = fVar233;
                      auVar145._12_4_ = fVar233;
                      auVar57 = vfmadd132ps_fma(auVar145,auVar165,local_3d0);
                      auVar136._4_4_ = fVar222;
                      auVar136._0_4_ = fVar222;
                      auVar136._8_4_ = fVar222;
                      auVar136._12_4_ = fVar222;
                      auVar57 = vfmadd132ps_fma(auVar136,auVar57,local_3c0);
                      auVar122._4_4_ = fVar238;
                      auVar122._0_4_ = fVar238;
                      auVar122._8_4_ = fVar238;
                      auVar122._12_4_ = fVar238;
                      auVar42 = vfmadd132ps_fma(auVar122,auVar57,local_3b0);
                      auVar57 = vshufps_avx(auVar42,auVar42,0xc9);
                      auVar58 = vshufps_avx(auVar56,auVar56,0xc9);
                      auVar123._0_4_ = auVar42._0_4_ * auVar58._0_4_;
                      auVar123._4_4_ = auVar42._4_4_ * auVar58._4_4_;
                      auVar123._8_4_ = auVar42._8_4_ * auVar58._8_4_;
                      auVar123._12_4_ = auVar42._12_4_ * auVar58._12_4_;
                      auVar56 = vfmsub231ps_fma(auVar123,auVar56,auVar57);
                      auVar148._8_4_ = 1;
                      auVar148._0_8_ = 0x100000001;
                      auVar148._12_4_ = 1;
                      auVar148._16_4_ = 1;
                      auVar148._20_4_ = 1;
                      auVar148._24_4_ = 1;
                      auVar148._28_4_ = 1;
                      local_100 = vpermps_avx2(auVar148,ZEXT1632(auVar40));
                      auVar87 = vpermps_avx2(auVar148,ZEXT1632(auVar56));
                      auVar169._8_4_ = 2;
                      auVar169._0_8_ = 0x200000002;
                      auVar169._12_4_ = 2;
                      auVar169._16_4_ = 2;
                      auVar169._20_4_ = 2;
                      auVar169._24_4_ = 2;
                      auVar169._28_4_ = 2;
                      local_160 = vpermps_avx2(auVar169,ZEXT1632(auVar56));
                      local_140 = auVar56._0_4_;
                      local_180[0] = (RTCHitN)auVar87[0];
                      local_180[1] = (RTCHitN)auVar87[1];
                      local_180[2] = (RTCHitN)auVar87[2];
                      local_180[3] = (RTCHitN)auVar87[3];
                      local_180[4] = (RTCHitN)auVar87[4];
                      local_180[5] = (RTCHitN)auVar87[5];
                      local_180[6] = (RTCHitN)auVar87[6];
                      local_180[7] = (RTCHitN)auVar87[7];
                      local_180[8] = (RTCHitN)auVar87[8];
                      local_180[9] = (RTCHitN)auVar87[9];
                      local_180[10] = (RTCHitN)auVar87[10];
                      local_180[0xb] = (RTCHitN)auVar87[0xb];
                      local_180[0xc] = (RTCHitN)auVar87[0xc];
                      local_180[0xd] = (RTCHitN)auVar87[0xd];
                      local_180[0xe] = (RTCHitN)auVar87[0xe];
                      local_180[0xf] = (RTCHitN)auVar87[0xf];
                      local_180[0x10] = (RTCHitN)auVar87[0x10];
                      local_180[0x11] = (RTCHitN)auVar87[0x11];
                      local_180[0x12] = (RTCHitN)auVar87[0x12];
                      local_180[0x13] = (RTCHitN)auVar87[0x13];
                      local_180[0x14] = (RTCHitN)auVar87[0x14];
                      local_180[0x15] = (RTCHitN)auVar87[0x15];
                      local_180[0x16] = (RTCHitN)auVar87[0x16];
                      local_180[0x17] = (RTCHitN)auVar87[0x17];
                      local_180[0x18] = (RTCHitN)auVar87[0x18];
                      local_180[0x19] = (RTCHitN)auVar87[0x19];
                      local_180[0x1a] = (RTCHitN)auVar87[0x1a];
                      local_180[0x1b] = (RTCHitN)auVar87[0x1b];
                      local_180[0x1c] = (RTCHitN)auVar87[0x1c];
                      local_180[0x1d] = (RTCHitN)auVar87[0x1d];
                      local_180[0x1e] = (RTCHitN)auVar87[0x1e];
                      local_180[0x1f] = (RTCHitN)auVar87[0x1f];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      fStack_11c = local_120;
                      fStack_118 = local_120;
                      fStack_114 = local_120;
                      fStack_110 = local_120;
                      fStack_10c = local_120;
                      fStack_108 = local_120;
                      fStack_104 = local_120;
                      local_e0 = local_1e0._0_8_;
                      uStack_d8 = local_1e0._8_8_;
                      uStack_d0 = local_1e0._16_8_;
                      uStack_c8 = local_1e0._24_8_;
                      local_c0 = local_200;
                      vpcmpeqd_avx2(local_200,local_200);
                      uStack_9c = context->user->instID[0];
                      local_a0 = uStack_9c;
                      uStack_98 = uStack_9c;
                      uStack_94 = uStack_9c;
                      uStack_90 = uStack_9c;
                      uStack_8c = uStack_9c;
                      uStack_88 = uStack_9c;
                      uStack_84 = uStack_9c;
                      uStack_7c = context->user->instPrimID[0];
                      local_80 = uStack_7c;
                      uStack_78 = uStack_7c;
                      uStack_74 = uStack_7c;
                      uStack_70 = uStack_7c;
                      uStack_6c = uStack_7c;
                      uStack_68 = uStack_7c;
                      uStack_64 = uStack_7c;
                      *(float *)(ray + k * 4 + 0x100) = fVar234;
                      local_400 = local_220;
                      local_430.valid = (int *)local_400;
                      local_430.geometryUserPtr = pGVar8->userPtr;
                      local_430.context = context->user;
                      local_430.ray = (RTCRayN *)ray;
                      local_430.hit = local_180;
                      local_430.N = 8;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_430);
                        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar277 = ZEXT1664(auVar40);
                        auVar276 = ZEXT464(0x3f800000);
                        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar274 = ZEXT1664(auVar40);
                        auVar40 = vxorps_avx512vl(auVar54,auVar54);
                        auVar270 = ZEXT1664(auVar40);
                      }
                      auVar40 = auVar270._0_16_;
                      if (local_400 == (undefined1  [32])0x0) {
                        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar275 = ZEXT1664(auVar40);
                        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar271 = ZEXT3264(auVar87);
                        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar272 = ZEXT1664(auVar40);
                        auVar273 = ZEXT3264(_DAT_01feed20);
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if (p_Var13 == (RTCFilterFunctionN)0x0) {
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar275 = ZEXT1664(auVar40);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar271 = ZEXT3264(auVar87);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar272 = ZEXT1664(auVar40);
                          auVar273 = ZEXT3264(_DAT_01feed20);
                        }
                        else {
                          auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar275 = ZEXT1664(auVar54);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar271 = ZEXT3264(auVar87);
                          auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar272 = ZEXT1664(auVar54);
                          auVar273 = ZEXT3264(_DAT_01feed20);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var13)(&local_430);
                            auVar273 = ZEXT3264(_DAT_01feed20);
                            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar272 = ZEXT1664(auVar54);
                            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar271 = ZEXT3264(auVar87);
                            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar277 = ZEXT1664(auVar54);
                            auVar276 = ZEXT464(0x3f800000);
                            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar274 = ZEXT1664(auVar54);
                            auVar40 = vxorps_avx512vl(auVar40,auVar40);
                            auVar270 = ZEXT1664(auVar40);
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar275 = ZEXT1664(auVar40);
                          }
                        }
                        in_ZMM21 = ZEXT464(0x3e2aaaab);
                        uVar3 = vptestmd_avx512vl(local_400,local_400);
                        auVar87 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar37 = (bool)((byte)uVar3 & 1);
                        bVar38 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar35 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar36 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = SUB81(uVar3 >> 7,0);
                        *(uint *)(local_430.ray + 0x100) =
                             (uint)bVar37 * auVar87._0_4_ |
                             (uint)!bVar37 * *(int *)(local_430.ray + 0x100);
                        *(uint *)(local_430.ray + 0x104) =
                             (uint)bVar38 * auVar87._4_4_ |
                             (uint)!bVar38 * *(int *)(local_430.ray + 0x104);
                        *(uint *)(local_430.ray + 0x108) =
                             (uint)bVar35 * auVar87._8_4_ |
                             (uint)!bVar35 * *(int *)(local_430.ray + 0x108);
                        *(uint *)(local_430.ray + 0x10c) =
                             (uint)bVar36 * auVar87._12_4_ |
                             (uint)!bVar36 * *(int *)(local_430.ray + 0x10c);
                        *(uint *)(local_430.ray + 0x110) =
                             (uint)bVar14 * auVar87._16_4_ |
                             (uint)!bVar14 * *(int *)(local_430.ray + 0x110);
                        *(uint *)(local_430.ray + 0x114) =
                             (uint)bVar15 * auVar87._20_4_ |
                             (uint)!bVar15 * *(int *)(local_430.ray + 0x114);
                        *(uint *)(local_430.ray + 0x118) =
                             (uint)bVar16 * auVar87._24_4_ |
                             (uint)!bVar16 * *(int *)(local_430.ray + 0x118);
                        *(uint *)(local_430.ray + 0x11c) =
                             (uint)bVar17 * auVar87._28_4_ |
                             (uint)!bVar17 * *(int *)(local_430.ray + 0x11c);
                        bVar25 = 1;
                        if (local_400 != (undefined1  [32])0x0) goto LAB_01b941f0;
                      }
                      in_ZMM21 = ZEXT464(0x3e2aaaab);
                      *(float *)(ray + k * 4 + 0x100) = fVar236;
                      goto LAB_01b941ee;
                    }
LAB_01b941f0:
                    bVar33 = (bool)(bVar33 | bVar25);
                  }
                }
              }
            }
          }
          break;
        }
        lVar29 = lVar29 + -1;
      } while (lVar29 != 0);
      goto LAB_01b932c1;
    }
    auVar116 = vinsertps_avx(auVar62,auVar63,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }